

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx2::CurveNiIntersector1<4>::
     intersect_t<embree::avx2::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::avx2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  undefined8 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  Primitive PVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  int iVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  bool bVar53;
  undefined1 auVar54 [12];
  bool bVar55;
  bool bVar56;
  bool bVar57;
  bool bVar58;
  bool bVar59;
  bool bVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  uint uVar89;
  ulong uVar90;
  ulong uVar91;
  ulong uVar92;
  undefined4 uVar93;
  long lVar94;
  bool bVar95;
  vint4 bi_2;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 extraout_var [60];
  undefined1 auVar126 [64];
  undefined1 extraout_var_00 [60];
  vint4 bi_1;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar154;
  float fVar155;
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [64];
  vint4 ai_2;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [64];
  float fVar195;
  float fVar204;
  float fVar205;
  vint4 ai;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar206;
  float fVar217;
  float fVar218;
  vint4 bi;
  undefined1 auVar225 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar219;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  float fVar220;
  float fVar221;
  float fVar222;
  undefined1 auVar216 [64];
  float fVar223;
  float fVar231;
  float fVar232;
  undefined1 auVar224 [16];
  undefined1 auVar226 [16];
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  float fVar237;
  float fVar246;
  float fVar247;
  vint4 ai_1;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar248;
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [64];
  float s;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  float t_2;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [32];
  float fVar258;
  float fVar264;
  float fVar265;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  float fVar266;
  undefined1 auVar261 [32];
  float fVar267;
  float fVar268;
  float fVar269;
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar270 [16];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [64];
  float t;
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  undefined1 auVar284 [64];
  undefined4 uVar294;
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined4 uVar295;
  undefined1 auVar293 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_b2c;
  ulong local_b28;
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  ulong local_aa8;
  undefined1 local_aa0 [32];
  RTCFilterFunctionNArguments local_a70;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  undefined1 auStack_970 [16];
  undefined8 local_950;
  float local_948;
  float local_944;
  undefined4 local_940;
  uint local_93c;
  uint local_938;
  uint local_934;
  uint local_930;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [48];
  undefined1 local_890 [16];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined1 local_7c0 [16];
  Primitive *local_7b0;
  ulong local_7a8;
  undefined4 local_7a0;
  undefined4 uStack_79c;
  undefined4 uStack_798;
  undefined4 uStack_794;
  undefined4 uStack_790;
  undefined4 uStack_78c;
  undefined4 uStack_788;
  undefined4 uStack_784;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [32];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined8 local_640;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined4 uStack_624;
  uint local_620;
  uint uStack_61c;
  uint uStack_618;
  uint uStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  uint uStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined4 local_400;
  undefined4 uStack_3fc;
  undefined4 uStack_3f8;
  undefined4 uStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined4 local_3e0;
  undefined4 uStack_3dc;
  undefined4 uStack_3d8;
  undefined4 uStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined4 local_3c0;
  undefined4 uStack_3bc;
  undefined4 uStack_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  
  PVar4 = prim[1];
  uVar91 = (ulong)(byte)PVar4;
  fVar223 = *(float *)(prim + uVar91 * 0x19 + 0x12);
  auVar106 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + uVar91 * 0x19 + 6));
  auVar96._0_4_ = fVar223 * auVar106._0_4_;
  auVar96._4_4_ = fVar223 * auVar106._4_4_;
  auVar96._8_4_ = fVar223 * auVar106._8_4_;
  auVar96._12_4_ = fVar223 * auVar106._12_4_;
  auVar207._0_4_ = fVar223 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar207._4_4_ = fVar223 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar207._8_4_ = fVar223 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar207._12_4_ = fVar223 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 4 + 6)));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar260 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 5 + 6)));
  auVar260 = vcvtdq2ps_avx(auVar260);
  auVar254 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 6 + 6)));
  auVar254 = vcvtdq2ps_avx(auVar254);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0xb + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar133 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6)));
  auVar133 = vcvtdq2ps_avx(auVar133);
  auVar225 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar4 * 0xc + uVar91 + 6)));
  auVar225 = vcvtdq2ps_avx(auVar225);
  uVar90 = (ulong)(uint)((int)(uVar91 * 9) * 2);
  auVar99 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 + 6)));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar98 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 + uVar91 + 6)));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar279 = ZEXT1664(auVar98);
  uVar90 = (ulong)(uint)((int)(uVar91 * 5) << 2);
  auVar156 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 + 6)));
  auVar156 = vcvtdq2ps_avx(auVar156);
  auVar284 = ZEXT1664(auVar156);
  auVar291._4_4_ = auVar207._0_4_;
  auVar291._0_4_ = auVar207._0_4_;
  auVar291._8_4_ = auVar207._0_4_;
  auVar291._12_4_ = auVar207._0_4_;
  auVar128 = vshufps_avx(auVar207,auVar207,0x55);
  auVar97 = vshufps_avx(auVar207,auVar207,0xaa);
  fVar223 = auVar97._0_4_;
  auVar259._0_4_ = fVar223 * auVar254._0_4_;
  fVar231 = auVar97._4_4_;
  auVar259._4_4_ = fVar231 * auVar254._4_4_;
  fVar232 = auVar97._8_4_;
  auVar259._8_4_ = fVar232 * auVar254._8_4_;
  fVar233 = auVar97._12_4_;
  auVar259._12_4_ = fVar233 * auVar254._12_4_;
  auVar253._0_4_ = auVar225._0_4_ * fVar223;
  auVar253._4_4_ = auVar225._4_4_ * fVar231;
  auVar253._8_4_ = auVar225._8_4_ * fVar232;
  auVar253._12_4_ = auVar225._12_4_ * fVar233;
  auVar238._0_4_ = auVar156._0_4_ * fVar223;
  auVar238._4_4_ = auVar156._4_4_ * fVar231;
  auVar238._8_4_ = auVar156._8_4_ * fVar232;
  auVar238._12_4_ = auVar156._12_4_ * fVar233;
  auVar97 = vfmadd231ps_fma(auVar259,auVar128,auVar260);
  auVar129 = vfmadd231ps_fma(auVar253,auVar128,auVar133);
  auVar128 = vfmadd231ps_fma(auVar238,auVar98,auVar128);
  auVar173 = vfmadd231ps_fma(auVar97,auVar291,auVar106);
  auVar262 = ZEXT1664(auVar173);
  auVar129 = vfmadd231ps_fma(auVar129,auVar291,auVar7);
  auVar197 = vfmadd231ps_fma(auVar128,auVar99,auVar291);
  auVar292._4_4_ = auVar96._0_4_;
  auVar292._0_4_ = auVar96._0_4_;
  auVar292._8_4_ = auVar96._0_4_;
  auVar292._12_4_ = auVar96._0_4_;
  auVar128 = vshufps_avx(auVar96,auVar96,0x55);
  auVar97 = vshufps_avx(auVar96,auVar96,0xaa);
  fVar223 = auVar97._0_4_;
  auVar208._0_4_ = fVar223 * auVar254._0_4_;
  fVar231 = auVar97._4_4_;
  auVar208._4_4_ = fVar231 * auVar254._4_4_;
  fVar232 = auVar97._8_4_;
  auVar208._8_4_ = fVar232 * auVar254._8_4_;
  fVar233 = auVar97._12_4_;
  auVar208._12_4_ = fVar233 * auVar254._12_4_;
  auVar127._0_4_ = auVar225._0_4_ * fVar223;
  auVar127._4_4_ = auVar225._4_4_ * fVar231;
  auVar127._8_4_ = auVar225._8_4_ * fVar232;
  auVar127._12_4_ = auVar225._12_4_ * fVar233;
  auVar97._0_4_ = auVar156._0_4_ * fVar223;
  auVar97._4_4_ = auVar156._4_4_ * fVar231;
  auVar97._8_4_ = auVar156._8_4_ * fVar232;
  auVar97._12_4_ = auVar156._12_4_ * fVar233;
  auVar260 = vfmadd231ps_fma(auVar208,auVar128,auVar260);
  auVar254 = vfmadd231ps_fma(auVar127,auVar128,auVar133);
  auVar133 = vfmadd231ps_fma(auVar97,auVar128,auVar98);
  auVar225 = vfmadd231ps_fma(auVar260,auVar292,auVar106);
  auVar98 = vfmadd231ps_fma(auVar254,auVar292,auVar7);
  auVar156 = vfmadd231ps_fma(auVar133,auVar292,auVar99);
  local_890._8_4_ = 0x7fffffff;
  local_890._0_8_ = 0x7fffffff7fffffff;
  local_890._12_4_ = 0x7fffffff;
  auVar106 = vandps_avx(auVar173,local_890);
  auVar196._8_4_ = 0x219392ef;
  auVar196._0_8_ = 0x219392ef219392ef;
  auVar196._12_4_ = 0x219392ef;
  auVar106 = vcmpps_avx(auVar106,auVar196,1);
  auVar260 = vblendvps_avx(auVar173,auVar196,auVar106);
  auVar106 = vandps_avx(auVar129,local_890);
  auVar106 = vcmpps_avx(auVar106,auVar196,1);
  auVar254 = vblendvps_avx(auVar129,auVar196,auVar106);
  auVar106 = vandps_avx(auVar197,local_890);
  auVar106 = vcmpps_avx(auVar106,auVar196,1);
  auVar106 = vblendvps_avx(auVar197,auVar196,auVar106);
  auVar7 = vrcpps_avx(auVar260);
  auVar224._8_4_ = 0x3f800000;
  auVar224._0_8_ = &DAT_3f8000003f800000;
  auVar224._12_4_ = 0x3f800000;
  auVar260 = vfnmadd213ps_fma(auVar260,auVar7,auVar224);
  auVar7 = vfmadd132ps_fma(auVar260,auVar7,auVar7);
  auVar260 = vrcpps_avx(auVar254);
  auVar254 = vfnmadd213ps_fma(auVar254,auVar260,auVar224);
  auVar133 = vfmadd132ps_fma(auVar254,auVar260,auVar260);
  auVar260 = vrcpps_avx(auVar106);
  auVar106 = vfnmadd213ps_fma(auVar106,auVar260,auVar224);
  auVar99 = vfmadd132ps_fma(auVar106,auVar260,auVar260);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + uVar91 * 7 + 6);
  auVar106 = vpmovsxwd_avx(auVar106);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,auVar225);
  auVar197._0_4_ = auVar7._0_4_ * auVar106._0_4_;
  auVar197._4_4_ = auVar7._4_4_ * auVar106._4_4_;
  auVar197._8_4_ = auVar7._8_4_ * auVar106._8_4_;
  auVar197._12_4_ = auVar7._12_4_ * auVar106._12_4_;
  auVar260._8_8_ = 0;
  auVar260._0_8_ = *(ulong *)(prim + uVar91 * 9 + 6);
  auVar106 = vpmovsxwd_avx(auVar260);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,auVar225);
  auVar209._0_4_ = auVar7._0_4_ * auVar106._0_4_;
  auVar209._4_4_ = auVar7._4_4_ * auVar106._4_4_;
  auVar209._8_4_ = auVar7._8_4_ * auVar106._8_4_;
  auVar209._12_4_ = auVar7._12_4_ * auVar106._12_4_;
  auVar129._1_3_ = 0;
  auVar129[0] = PVar4;
  auVar254._8_8_ = 0;
  auVar254._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  auVar260 = vpmovsxwd_avx(auVar254);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar91 * -2 + 6);
  auVar106 = vpmovsxwd_avx(auVar7);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,auVar98);
  auVar239._0_4_ = auVar106._0_4_ * auVar133._0_4_;
  auVar239._4_4_ = auVar106._4_4_ * auVar133._4_4_;
  auVar239._8_4_ = auVar106._8_4_ * auVar133._8_4_;
  auVar239._12_4_ = auVar106._12_4_ * auVar133._12_4_;
  auVar106 = vcvtdq2ps_avx(auVar260);
  auVar106 = vsubps_avx(auVar106,auVar98);
  auVar128._0_4_ = auVar133._0_4_ * auVar106._0_4_;
  auVar128._4_4_ = auVar133._4_4_ * auVar106._4_4_;
  auVar128._8_4_ = auVar133._8_4_ * auVar106._8_4_;
  auVar128._12_4_ = auVar133._12_4_ * auVar106._12_4_;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = *(ulong *)(prim + uVar90 + uVar91 + 6);
  auVar106 = vpmovsxwd_avx(auVar133);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,auVar156);
  auVar173._0_4_ = auVar99._0_4_ * auVar106._0_4_;
  auVar173._4_4_ = auVar99._4_4_ * auVar106._4_4_;
  auVar173._8_4_ = auVar99._8_4_ * auVar106._8_4_;
  auVar173._12_4_ = auVar99._12_4_ * auVar106._12_4_;
  auVar225._8_8_ = 0;
  auVar225._0_8_ = *(ulong *)(prim + uVar91 * 0x17 + 6);
  auVar106 = vpmovsxwd_avx(auVar225);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,auVar156);
  auVar98._0_4_ = auVar99._0_4_ * auVar106._0_4_;
  auVar98._4_4_ = auVar99._4_4_ * auVar106._4_4_;
  auVar98._8_4_ = auVar99._8_4_ * auVar106._8_4_;
  auVar98._12_4_ = auVar99._12_4_ * auVar106._12_4_;
  auVar106 = vpminsd_avx(auVar197,auVar209);
  auVar260 = vpminsd_avx(auVar239,auVar128);
  auVar106 = vmaxps_avx(auVar106,auVar260);
  auVar260 = vpminsd_avx(auVar173,auVar98);
  uVar93 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar249._4_4_ = uVar93;
  auVar249._0_4_ = uVar93;
  auVar249._8_4_ = uVar93;
  auVar249._12_4_ = uVar93;
  auVar260 = vmaxps_avx(auVar260,auVar249);
  auVar106 = vmaxps_avx(auVar106,auVar260);
  local_4d0._0_4_ = auVar106._0_4_ * 0.99999964;
  local_4d0._4_4_ = auVar106._4_4_ * 0.99999964;
  local_4d0._8_4_ = auVar106._8_4_ * 0.99999964;
  local_4d0._12_4_ = auVar106._12_4_ * 0.99999964;
  auVar106 = vpmaxsd_avx(auVar197,auVar209);
  auVar260 = vpmaxsd_avx(auVar239,auVar128);
  auVar106 = vminps_avx(auVar106,auVar260);
  auVar260 = vpmaxsd_avx(auVar173,auVar98);
  fVar223 = (ray->super_RayK<1>).tfar;
  auVar156._4_4_ = fVar223;
  auVar156._0_4_ = fVar223;
  auVar156._8_4_ = fVar223;
  auVar156._12_4_ = fVar223;
  auVar260 = vminps_avx(auVar260,auVar156);
  auVar106 = vminps_avx(auVar106,auVar260);
  auVar99._0_4_ = auVar106._0_4_ * 1.0000004;
  auVar99._4_4_ = auVar106._4_4_ * 1.0000004;
  auVar99._8_4_ = auVar106._8_4_ * 1.0000004;
  auVar99._12_4_ = auVar106._12_4_ * 1.0000004;
  auVar129[4] = PVar4;
  auVar129._5_3_ = 0;
  auVar129[8] = PVar4;
  auVar129._9_3_ = 0;
  auVar129[0xc] = PVar4;
  auVar129._13_3_ = 0;
  auVar260 = vpcmpgtd_avx(auVar129,_DAT_01ff0cf0);
  auVar106 = vcmpps_avx(local_4d0,auVar99,2);
  auVar106 = vandps_avx(auVar106,auVar260);
  uVar89 = vmovmskps_avx(auVar106);
  if (uVar89 == 0) {
    return;
  }
  uVar89 = uVar89 & 0xff;
  auVar121._16_16_ = mm_lookupmask_ps._240_16_;
  auVar121._0_16_ = mm_lookupmask_ps._240_16_;
  local_420 = vblendps_avx(auVar121,ZEXT832(0) << 0x20,0x80);
  local_7a0 = 0x7fffffff;
  uStack_79c = 0x7fffffff;
  uStack_798 = 0x7fffffff;
  uStack_794 = 0x7fffffff;
  uStack_790 = 0x7fffffff;
  uStack_78c = 0x7fffffff;
  uStack_788 = 0x7fffffff;
  uStack_784 = 0x7fffffff;
  local_7b0 = prim;
  local_620 = 0x80000000;
  uStack_61c = 0x80000000;
  uStack_618 = 0x80000000;
  uStack_614 = 0x80000000;
  fStack_610 = -0.0;
  fStack_60c = -0.0;
  fStack_608 = -0.0;
  uStack_604 = 0x80000000;
LAB_016b1f54:
  lVar94 = 0;
  local_7a8 = (ulong)uVar89;
  for (uVar90 = local_7a8; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x8000000000000000) {
    lVar94 = lVar94 + 1;
  }
  local_b28 = (ulong)*(uint *)(local_7b0 + 2);
  pGVar5 = (context->scene->geometries).items[*(uint *)(local_7b0 + 2)].ptr;
  local_aa8 = (ulong)*(uint *)(local_7b0 + lVar94 * 4 + 6);
  uVar90 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(local_7b0 + lVar94 * 4 + 6));
  p_Var6 = pGVar5[1].intersectionFilterN;
  lVar94 = *(long *)&pGVar5[1].time_range.upper;
  auVar106 = *(undefined1 (*) [16])(lVar94 + (long)p_Var6 * uVar90);
  auVar260 = *(undefined1 (*) [16])(lVar94 + (uVar90 + 1) * (long)p_Var6);
  local_7a8 = local_7a8 - 1 & local_7a8;
  if (local_7a8 != 0) {
    uVar92 = local_7a8 - 1 & local_7a8;
    for (uVar91 = local_7a8; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x8000000000000000) {
    }
    if (uVar92 != 0) {
      for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar210._0_4_ = (auVar106._0_4_ + auVar260._0_4_) * 0.5;
  auVar210._4_4_ = (auVar106._4_4_ + auVar260._4_4_) * 0.5;
  auVar210._8_4_ = (auVar106._8_4_ + auVar260._8_4_) * 0.5;
  auVar210._12_4_ = (auVar106._12_4_ + auVar260._12_4_) * 0.5;
  aVar2 = (ray->super_RayK<1>).org.field_0;
  aVar3 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar254 = vsubps_avx(auVar210,(undefined1  [16])aVar2);
  auVar254 = vdpps_avx(auVar254,(undefined1  [16])aVar3,0x7f);
  auVar7 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
  auVar133 = vrcpss_avx(auVar7,auVar7);
  auVar245 = ZEXT1664(auVar133);
  auVar7 = vfnmadd213ss_fma(auVar133,auVar7,ZEXT416(0x40000000));
  fVar223 = auVar254._0_4_ * auVar133._0_4_ * auVar7._0_4_;
  local_7c0 = ZEXT416((uint)fVar223);
  auVar211._4_4_ = fVar223;
  auVar211._0_4_ = fVar223;
  auVar211._8_4_ = fVar223;
  auVar211._12_4_ = fVar223;
  fStack_730 = fVar223;
  _local_740 = auVar211;
  fStack_72c = fVar223;
  fStack_728 = fVar223;
  fStack_724 = fVar223;
  auVar254 = vfmadd231ps_fma((undefined1  [16])aVar2,(undefined1  [16])aVar3,auVar211);
  auVar254 = vblendps_avx(auVar254,_DAT_01feba10,8);
  local_9d0 = vsubps_avx(auVar106,auVar254);
  local_9e0 = vsubps_avx(*(undefined1 (*) [16])(lVar94 + (uVar90 + 2) * (long)p_Var6),auVar254);
  auVar194 = ZEXT1664(local_9e0);
  local_9f0 = vsubps_avx(auVar260,auVar254);
  _local_a00 = vsubps_avx(*(undefined1 (*) [16])(lVar94 + (uVar90 + 3) * (long)p_Var6),auVar254);
  auVar106 = vmovshdup_avx(local_9d0);
  local_1a0 = auVar106._0_8_;
  uStack_198 = local_1a0;
  uStack_190 = local_1a0;
  uStack_188 = local_1a0;
  auVar106 = vshufps_avx(local_9d0,local_9d0,0xaa);
  local_2a0 = auVar106._0_8_;
  uStack_298 = local_2a0;
  uStack_290 = local_2a0;
  uStack_288 = local_2a0;
  auVar106 = vshufps_avx(local_9d0,local_9d0,0xff);
  local_1c0 = auVar106._0_8_;
  uStack_1b8 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1a8 = local_1c0;
  auVar106 = vmovshdup_avx(local_9f0);
  local_1e0 = auVar106._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar106 = vshufps_avx(local_9f0,local_9f0,0xaa);
  local_2c0 = auVar106._0_8_;
  uStack_2b8 = local_2c0;
  uStack_2b0 = local_2c0;
  uStack_2a8 = local_2c0;
  auVar106 = vshufps_avx(local_9f0,local_9f0,0xff);
  local_2e0 = auVar106._0_8_;
  uStack_2d8 = local_2e0;
  uStack_2d0 = local_2e0;
  uStack_2c8 = local_2e0;
  auVar106 = vmovshdup_avx(local_9e0);
  local_300 = auVar106._0_8_;
  uStack_2f8 = local_300;
  uStack_2f0 = local_300;
  uStack_2e8 = local_300;
  auVar106 = vshufps_avx(local_9e0,local_9e0,0xaa);
  local_320 = auVar106._0_8_;
  uStack_318 = local_320;
  uStack_310 = local_320;
  uStack_308 = local_320;
  auVar106 = vshufps_avx(local_9e0,local_9e0,0xff);
  local_340 = auVar106._0_8_;
  uStack_338 = local_340;
  uStack_330 = local_340;
  uStack_328 = local_340;
  auVar106 = vmovshdup_avx(_local_a00);
  local_360 = auVar106._0_8_;
  uStack_358 = local_360;
  uStack_350 = local_360;
  uStack_348 = local_360;
  auVar106 = vshufps_avx(_local_a00,_local_a00,0xaa);
  local_380 = auVar106._0_8_;
  uStack_378 = local_380;
  uStack_370 = local_380;
  uStack_368 = local_380;
  auVar106 = vshufps_avx(_local_a00,_local_a00,0xff);
  local_3a0 = auVar106._0_8_;
  uStack_398 = local_3a0;
  uStack_390 = local_3a0;
  uStack_388 = local_3a0;
  auVar100._0_4_ = aVar3.x * aVar3.x;
  auVar100._4_4_ = aVar3.y * aVar3.y;
  auVar100._8_4_ = aVar3.z * aVar3.z;
  auVar100._12_4_ = aVar3.field_3.w * aVar3.field_3.w;
  auVar106 = vshufps_avx(auVar100,auVar100,0xaa);
  auVar111._0_8_ = auVar106._0_8_;
  auVar111._8_8_ = auVar111._0_8_;
  auVar111._16_8_ = auVar111._0_8_;
  auVar111._24_8_ = auVar111._0_8_;
  uVar93 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  local_540._4_4_ = uVar93;
  local_540._0_4_ = uVar93;
  fStack_538 = (float)uVar93;
  fStack_534 = (float)uVar93;
  fStack_530 = (float)uVar93;
  fStack_52c = (float)uVar93;
  fStack_528 = (float)uVar93;
  register0x0000131c = uVar93;
  uVar93 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  local_560._4_4_ = uVar93;
  local_560._0_4_ = uVar93;
  fStack_558 = (float)uVar93;
  fStack_554 = (float)uVar93;
  fStack_550 = (float)uVar93;
  fStack_54c = (float)uVar93;
  fStack_548 = (float)uVar93;
  register0x0000135c = uVar93;
  auVar216 = ZEXT3264(_local_560);
  auVar106 = vfmadd231ps_fma(auVar111,_local_560,_local_560);
  auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),_local_540,_local_540);
  uVar91 = 0;
  local_580 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_57c = local_580;
  fStack_578 = local_580;
  fStack_574 = local_580;
  fStack_570 = local_580;
  fStack_56c = local_580;
  fStack_568 = local_580;
  fStack_564 = local_580;
  local_3c0 = local_9d0._0_4_;
  uStack_3bc = local_3c0;
  uStack_3b8 = local_3c0;
  uStack_3b4 = local_3c0;
  uStack_3b0 = local_3c0;
  uStack_3ac = local_3c0;
  uStack_3a8 = local_3c0;
  uStack_3a4 = local_3c0;
  local_3e0 = local_9f0._0_4_;
  uStack_3dc = local_3e0;
  uStack_3d8 = local_3e0;
  uStack_3d4 = local_3e0;
  uStack_3d0 = local_3e0;
  uStack_3cc = local_3e0;
  uStack_3c8 = local_3e0;
  uStack_3c4 = local_3e0;
  local_400 = local_9e0._0_4_;
  uStack_3fc = local_400;
  uStack_3f8 = local_400;
  uStack_3f4 = local_400;
  uStack_3f0 = local_400;
  uStack_3ec = local_400;
  uStack_3e8 = local_400;
  uStack_3e4 = local_400;
  local_220 = local_a00._0_4_;
  fStack_21c = local_220;
  fStack_218 = local_220;
  fStack_214 = local_220;
  fStack_210 = local_220;
  fStack_20c = local_220;
  fStack_208 = local_220;
  fStack_204 = local_220;
  local_200 = ZEXT1632(auVar106);
  auVar280._4_4_ = uStack_79c;
  auVar280._0_4_ = local_7a0;
  auVar280._8_4_ = uStack_798;
  auVar280._12_4_ = uStack_794;
  auVar280._16_4_ = uStack_790;
  auVar280._20_4_ = uStack_78c;
  auVar280._24_4_ = uStack_788;
  auVar280._28_4_ = uStack_784;
  local_440 = vandps_avx(ZEXT1632(auVar106),auVar280);
  local_7d0 = 0x3f80000000000000;
  uStack_7c8 = 0;
  uVar90 = 1;
  do {
    auVar61._8_8_ = uStack_7c8;
    auVar61._0_8_ = local_7d0;
    auVar106 = vmovshdup_avx(auVar61);
    fVar231 = (float)local_7d0;
    fVar223 = auVar106._0_4_ - fVar231;
    fVar154 = fVar223 * 0.04761905;
    local_a40._4_4_ = fVar231;
    local_a40._0_4_ = fVar231;
    local_a40._8_4_ = fVar231;
    local_a40._12_4_ = fVar231;
    local_a40._16_4_ = fVar231;
    local_a40._20_4_ = fVar231;
    local_a40._24_4_ = fVar231;
    local_a40._28_4_ = fVar231;
    local_900._4_4_ = fVar223;
    local_900._0_4_ = fVar223;
    local_900._8_4_ = fVar223;
    local_900._12_4_ = fVar223;
    local_900._16_4_ = fVar223;
    local_900._20_4_ = fVar223;
    local_900._24_4_ = fVar223;
    local_900._28_4_ = fVar223;
    auVar106 = vfmadd231ps_fma(local_a40,local_900,_DAT_02020f20);
    auVar112._8_4_ = 0x3f800000;
    auVar112._0_8_ = &DAT_3f8000003f800000;
    auVar112._12_4_ = 0x3f800000;
    auVar112._16_4_ = 0x3f800000;
    auVar112._20_4_ = 0x3f800000;
    auVar112._24_4_ = 0x3f800000;
    auVar112._28_4_ = 0x3f800000;
    auVar121 = vsubps_avx(auVar112,ZEXT1632(auVar106));
    fVar155 = auVar106._0_4_;
    fVar195 = auVar106._4_4_;
    fVar204 = auVar106._8_4_;
    fVar205 = auVar106._12_4_;
    fVar223 = auVar121._0_4_;
    fVar231 = auVar121._4_4_;
    fVar232 = auVar121._8_4_;
    fVar233 = auVar121._12_4_;
    fVar234 = auVar121._16_4_;
    fVar235 = auVar121._20_4_;
    fVar236 = auVar121._24_4_;
    auVar194._0_28_ =
         ZEXT1628(CONCAT412(fVar205 * fVar205,
                            CONCAT48(fVar204 * fVar204,CONCAT44(fVar195 * fVar195,fVar155 * fVar155)
                                    )));
    fVar237 = fVar155 * 3.0;
    fVar246 = fVar195 * 3.0;
    fVar247 = fVar204 * 3.0;
    fVar248 = fVar205 * 3.0;
    auVar263._0_4_ = fVar223 * fVar223;
    auVar263._4_4_ = fVar231 * fVar231;
    auVar263._8_4_ = fVar232 * fVar232;
    auVar263._12_4_ = fVar233 * fVar233;
    auVar263._16_4_ = fVar234 * fVar234;
    auVar263._20_4_ = fVar235 * fVar235;
    auVar263._28_36_ = auVar262._28_36_;
    auVar263._24_4_ = fVar236 * fVar236;
    auVar262._0_4_ = (auVar263._0_4_ * (fVar223 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar262._4_4_ = (auVar263._4_4_ * (fVar231 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar262._8_4_ = (auVar263._8_4_ * (fVar232 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar262._12_4_ = (auVar263._12_4_ * (fVar233 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar262._16_4_ = (auVar263._16_4_ * (fVar234 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar262._20_4_ = (auVar263._20_4_ * (fVar235 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar262._28_36_ = auVar284._28_36_;
    auVar262._24_4_ = (auVar263._24_4_ * (fVar236 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar280 = auVar262._0_32_;
    fVar206 = fVar155 * fVar155 * (float)((uint)fVar223 ^ local_620) * 0.5;
    fVar217 = fVar195 * fVar195 * (float)((uint)fVar231 ^ uStack_61c) * 0.5;
    fVar218 = fVar204 * fVar204 * (float)((uint)fVar232 ^ uStack_618) * 0.5;
    fVar219 = fVar205 * fVar205 * (float)((uint)fVar233 ^ uStack_614) * 0.5;
    fVar220 = (float)((uint)fVar234 ^ (uint)fStack_610) * 0.0 * 0.0 * 0.5;
    fVar221 = (float)((uint)fVar235 ^ (uint)fStack_60c) * 0.0 * 0.0 * 0.5;
    fVar222 = (float)((uint)fVar236 ^ (uint)fStack_608) * 0.0 * 0.0 * 0.5;
    auVar8._4_4_ = fStack_21c * fVar217;
    auVar8._0_4_ = local_220 * fVar206;
    auVar8._8_4_ = fStack_218 * fVar218;
    auVar8._12_4_ = fStack_214 * fVar219;
    auVar8._16_4_ = fStack_210 * fVar220;
    auVar8._20_4_ = fStack_20c * fVar221;
    auVar8._24_4_ = fStack_208 * fVar222;
    auVar8._28_4_ = auVar121._28_4_ ^ uStack_604;
    auVar142._4_4_ = fVar217 * local_360._4_4_;
    auVar142._0_4_ = fVar206 * (float)local_360;
    auVar142._8_4_ = fVar218 * (float)uStack_358;
    auVar142._12_4_ = fVar219 * uStack_358._4_4_;
    auVar142._16_4_ = fVar220 * (float)uStack_350;
    auVar142._20_4_ = fVar221 * uStack_350._4_4_;
    auVar142._24_4_ = fVar222 * (float)uStack_348;
    auVar142._28_4_ = uStack_604;
    auVar229._4_4_ = fVar217 * local_380._4_4_;
    auVar229._0_4_ = fVar206 * (float)local_380;
    auVar229._8_4_ = fVar218 * (float)uStack_378;
    auVar229._12_4_ = fVar219 * uStack_378._4_4_;
    auVar229._16_4_ = fVar220 * (float)uStack_370;
    auVar229._20_4_ = fVar221 * uStack_370._4_4_;
    auVar229._24_4_ = fVar222 * (float)uStack_368;
    auVar229._28_4_ = 0x40000000;
    auVar252._4_4_ = fVar217 * local_3a0._4_4_;
    auVar252._0_4_ = fVar206 * (float)local_3a0;
    auVar252._8_4_ = fVar218 * (float)uStack_398;
    auVar252._12_4_ = fVar219 * uStack_398._4_4_;
    auVar252._16_4_ = fVar220 * (float)uStack_390;
    auVar252._20_4_ = fVar221 * uStack_390._4_4_;
    auVar252._24_4_ = fVar222 * (float)uStack_388;
    auVar252._28_4_ = auVar216._28_4_;
    auVar68._4_4_ = uStack_3fc;
    auVar68._0_4_ = local_400;
    auVar68._8_4_ = uStack_3f8;
    auVar68._12_4_ = uStack_3f4;
    auVar68._16_4_ = uStack_3f0;
    auVar68._20_4_ = uStack_3ec;
    auVar68._24_4_ = uStack_3e8;
    auVar68._28_4_ = uStack_3e4;
    auVar106 = vfmadd231ps_fma(auVar8,auVar280,auVar68);
    auVar78._8_8_ = uStack_2f8;
    auVar78._0_8_ = local_300;
    auVar78._16_8_ = uStack_2f0;
    auVar78._24_8_ = uStack_2e8;
    auVar260 = vfmadd231ps_fma(auVar142,auVar280,auVar78);
    auVar76._8_8_ = uStack_318;
    auVar76._0_8_ = local_320;
    auVar76._16_8_ = uStack_310;
    auVar76._24_8_ = uStack_308;
    auVar254 = vfmadd231ps_fma(auVar229,auVar280,auVar76);
    auVar74._8_8_ = uStack_338;
    auVar74._0_8_ = local_340;
    auVar74._16_8_ = uStack_330;
    auVar74._24_8_ = uStack_328;
    auVar7 = vfmadd231ps_fma(auVar252,auVar280,auVar74);
    auVar12._4_4_ = fVar231 * fVar231 * (float)((uint)fVar195 ^ uStack_61c) * 0.5;
    auVar12._0_4_ = fVar223 * fVar223 * (float)((uint)fVar155 ^ local_620) * 0.5;
    auVar12._8_4_ = fVar232 * fVar232 * (float)((uint)fVar204 ^ uStack_618) * 0.5;
    auVar12._12_4_ = fVar233 * fVar233 * (float)((uint)fVar205 ^ uStack_614) * 0.5;
    auVar12._16_4_ = fVar234 * fVar234 * fStack_610 * 0.5;
    auVar12._20_4_ = fVar235 * fVar235 * fStack_60c * 0.5;
    auVar12._24_4_ = fVar236 * fVar236 * fStack_608 * 0.5;
    auVar12._28_4_ = auVar279._28_4_;
    auVar272._4_4_ = ((fVar246 + -5.0) * fVar195 * fVar195 + 2.0) * 0.5;
    auVar272._0_4_ = ((fVar237 + -5.0) * fVar155 * fVar155 + 2.0) * 0.5;
    auVar272._8_4_ = ((fVar247 + -5.0) * fVar204 * fVar204 + 2.0) * 0.5;
    auVar272._12_4_ = ((fVar248 + -5.0) * fVar205 * fVar205 + 2.0) * 0.5;
    auVar272._16_4_ = 0x3f800000;
    auVar272._20_4_ = 0x3f800000;
    auVar272._24_4_ = 0x3f800000;
    auVar272._28_4_ = auVar284._28_4_ + 2.0;
    auVar70._4_4_ = uStack_3dc;
    auVar70._0_4_ = local_3e0;
    auVar70._8_4_ = uStack_3d8;
    auVar70._12_4_ = uStack_3d4;
    auVar70._16_4_ = uStack_3d0;
    auVar70._20_4_ = uStack_3cc;
    auVar70._24_4_ = uStack_3c8;
    auVar70._28_4_ = uStack_3c4;
    auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar272,auVar70);
    auVar86._8_8_ = uStack_1d8;
    auVar86._0_8_ = local_1e0;
    auVar86._16_8_ = uStack_1d0;
    auVar86._24_8_ = uStack_1c8;
    auVar260 = vfmadd231ps_fma(ZEXT1632(auVar260),auVar272,auVar86);
    auVar82._8_8_ = uStack_2b8;
    auVar82._0_8_ = local_2c0;
    auVar82._16_8_ = uStack_2b0;
    auVar82._24_8_ = uStack_2a8;
    auVar254 = vfmadd231ps_fma(ZEXT1632(auVar254),auVar272,auVar82);
    auVar80._8_8_ = uStack_2d8;
    auVar80._0_8_ = local_2e0;
    auVar80._16_8_ = uStack_2d0;
    auVar80._24_8_ = uStack_2c8;
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar272,auVar80);
    auVar72._4_4_ = uStack_3bc;
    auVar72._0_4_ = local_3c0;
    auVar72._8_4_ = uStack_3b8;
    auVar72._12_4_ = uStack_3b4;
    auVar72._16_4_ = uStack_3b0;
    auVar72._20_4_ = uStack_3ac;
    auVar72._24_4_ = uStack_3a8;
    auVar72._28_4_ = uStack_3a4;
    auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar12,auVar72);
    auVar88._8_8_ = uStack_198;
    auVar88._0_8_ = local_1a0;
    auVar88._16_8_ = uStack_190;
    auVar88._24_8_ = uStack_188;
    auVar260 = vfmadd231ps_fma(ZEXT1632(auVar260),auVar12,auVar88);
    local_ae0 = ZEXT1632(auVar260);
    auVar84._8_8_ = uStack_298;
    auVar84._0_8_ = local_2a0;
    auVar84._16_8_ = uStack_290;
    auVar84._24_8_ = uStack_288;
    auVar260 = vfmadd231ps_fma(ZEXT1632(auVar254),auVar12,auVar84);
    auVar87._8_8_ = uStack_1b8;
    auVar87._0_8_ = local_1c0;
    auVar87._16_8_ = uStack_1b0;
    auVar87._24_8_ = uStack_1a8;
    auVar254 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar87,auVar12);
    auVar216 = ZEXT1664(auVar254);
    auVar120._4_4_ = (fVar231 + fVar231) * fVar195;
    auVar120._0_4_ = (fVar223 + fVar223) * fVar155;
    auVar120._8_4_ = (fVar232 + fVar232) * fVar204;
    auVar120._12_4_ = (fVar233 + fVar233) * fVar205;
    auVar120._16_4_ = (fVar234 + fVar234) * 0.0;
    auVar120._20_4_ = (fVar235 + fVar235) * 0.0;
    auVar120._24_4_ = (fVar236 + fVar236) * 0.0;
    auVar120._28_4_ = 0;
    auVar280 = vsubps_avx(auVar120,auVar263._0_32_);
    fVar206 = auVar245._28_4_ + 2.0;
    auVar9._4_4_ = (fVar231 + fVar231) * (fVar246 + 2.0);
    auVar9._0_4_ = (fVar223 + fVar223) * (fVar237 + 2.0);
    auVar9._8_4_ = (fVar232 + fVar232) * (fVar247 + 2.0);
    auVar9._12_4_ = (fVar233 + fVar233) * (fVar248 + 2.0);
    auVar9._16_4_ = (fVar234 + fVar234) * 2.0;
    auVar9._20_4_ = (fVar235 + fVar235) * 2.0;
    auVar9._24_4_ = (fVar236 + fVar236) * 2.0;
    auVar9._28_4_ = fVar206;
    auVar10._4_4_ = fVar231 * fVar231 * 3.0;
    auVar10._0_4_ = fVar223 * fVar223 * 3.0;
    auVar10._8_4_ = fVar232 * fVar232 * 3.0;
    auVar10._12_4_ = fVar233 * fVar233 * 3.0;
    auVar10._16_4_ = fVar234 * fVar234 * 3.0;
    auVar10._20_4_ = fVar235 * fVar235 * 3.0;
    auVar10._24_4_ = fVar236 * fVar236 * 3.0;
    auVar10._28_4_ = auVar121._28_4_;
    auVar121 = vsubps_avx(auVar9,auVar10);
    auVar111 = vsubps_avx(auVar194._0_32_,auVar120);
    auVar13._4_4_ = auVar280._4_4_ * 0.5;
    auVar13._0_4_ = auVar280._0_4_ * 0.5;
    auVar13._8_4_ = auVar280._8_4_ * 0.5;
    auVar13._12_4_ = auVar280._12_4_ * 0.5;
    auVar13._16_4_ = auVar280._16_4_ * 0.5;
    auVar13._20_4_ = auVar280._20_4_ * 0.5;
    auVar13._24_4_ = auVar280._24_4_ * 0.5;
    auVar13._28_4_ = fVar206;
    auVar14._28_4_ = auVar245._28_4_ + -5.0 + 0.0;
    auVar14._0_28_ =
         ZEXT1628(CONCAT412(((fVar205 + fVar205) * (fVar248 + -5.0) + fVar248 * fVar205) * 0.5,
                            CONCAT48(((fVar204 + fVar204) * (fVar247 + -5.0) + fVar247 * fVar204) *
                                     0.5,CONCAT44(((fVar195 + fVar195) * (fVar246 + -5.0) +
                                                  fVar246 * fVar195) * 0.5,
                                                  ((fVar155 + fVar155) * (fVar237 + -5.0) +
                                                  fVar237 * fVar155) * 0.5))));
    auVar15._4_4_ = auVar121._4_4_ * 0.5;
    auVar15._0_4_ = auVar121._0_4_ * 0.5;
    auVar15._8_4_ = auVar121._8_4_ * 0.5;
    auVar15._12_4_ = auVar121._12_4_ * 0.5;
    auVar15._16_4_ = auVar121._16_4_ * 0.5;
    auVar15._20_4_ = auVar121._20_4_ * 0.5;
    fVar155 = auVar121._28_4_;
    auVar15._24_4_ = auVar121._24_4_ * 0.5;
    auVar15._28_4_ = fVar155;
    fVar223 = auVar111._0_4_ * 0.5;
    fVar231 = auVar111._4_4_ * 0.5;
    fVar232 = auVar111._8_4_ * 0.5;
    fVar233 = auVar111._12_4_ * 0.5;
    fVar234 = auVar111._16_4_ * 0.5;
    fVar235 = auVar111._20_4_ * 0.5;
    fVar236 = auVar111._24_4_ * 0.5;
    auVar16._4_4_ = fStack_21c * fVar231;
    auVar16._0_4_ = local_220 * fVar223;
    auVar16._8_4_ = fStack_218 * fVar232;
    auVar16._12_4_ = fStack_214 * fVar233;
    auVar16._16_4_ = fStack_210 * fVar234;
    auVar16._20_4_ = fStack_20c * fVar235;
    auVar16._24_4_ = fStack_208 * fVar236;
    auVar16._28_4_ = fStack_204;
    auVar17._4_4_ = fVar231 * local_360._4_4_;
    auVar17._0_4_ = fVar223 * (float)local_360;
    auVar17._8_4_ = fVar232 * (float)uStack_358;
    auVar17._12_4_ = fVar233 * uStack_358._4_4_;
    auVar17._16_4_ = fVar234 * (float)uStack_350;
    auVar17._20_4_ = fVar235 * uStack_350._4_4_;
    auVar17._24_4_ = fVar236 * (float)uStack_348;
    auVar17._28_4_ = 0x40000000;
    auVar18._4_4_ = fVar231 * local_380._4_4_;
    auVar18._0_4_ = fVar223 * (float)local_380;
    auVar18._8_4_ = fVar232 * (float)uStack_378;
    auVar18._12_4_ = fVar233 * uStack_378._4_4_;
    auVar18._16_4_ = fVar234 * (float)uStack_370;
    auVar18._20_4_ = fVar235 * uStack_370._4_4_;
    auVar18._24_4_ = fVar236 * (float)uStack_368;
    auVar18._28_4_ = auVar280._28_4_;
    auVar19._4_4_ = fVar231 * local_3a0._4_4_;
    auVar19._0_4_ = fVar223 * (float)local_3a0;
    auVar19._8_4_ = fVar232 * (float)uStack_398;
    auVar19._12_4_ = fVar233 * uStack_398._4_4_;
    auVar19._16_4_ = fVar234 * (float)uStack_390;
    auVar19._20_4_ = fVar235 * uStack_390._4_4_;
    auVar19._24_4_ = fVar236 * (float)uStack_388;
    auVar19._28_4_ = auVar111._28_4_;
    auVar69._4_4_ = uStack_3fc;
    auVar69._0_4_ = local_400;
    auVar69._8_4_ = uStack_3f8;
    auVar69._12_4_ = uStack_3f4;
    auVar69._16_4_ = uStack_3f0;
    auVar69._20_4_ = uStack_3ec;
    auVar69._24_4_ = uStack_3e8;
    auVar69._28_4_ = uStack_3e4;
    auVar7 = vfmadd231ps_fma(auVar16,auVar15,auVar69);
    auVar79._8_8_ = uStack_2f8;
    auVar79._0_8_ = local_300;
    auVar79._16_8_ = uStack_2f0;
    auVar79._24_8_ = uStack_2e8;
    auVar133 = vfmadd231ps_fma(auVar17,auVar15,auVar79);
    auVar77._8_8_ = uStack_318;
    auVar77._0_8_ = local_320;
    auVar77._16_8_ = uStack_310;
    auVar77._24_8_ = uStack_308;
    auVar225 = vfmadd231ps_fma(auVar18,auVar15,auVar77);
    auVar75._8_8_ = uStack_338;
    auVar75._0_8_ = local_340;
    auVar75._16_8_ = uStack_330;
    auVar75._24_8_ = uStack_328;
    auVar99 = vfmadd231ps_fma(auVar19,auVar15,auVar75);
    auVar71._4_4_ = uStack_3dc;
    auVar71._0_4_ = local_3e0;
    auVar71._8_4_ = uStack_3d8;
    auVar71._12_4_ = uStack_3d4;
    auVar71._16_4_ = uStack_3d0;
    auVar71._20_4_ = uStack_3cc;
    auVar71._24_4_ = uStack_3c8;
    auVar71._28_4_ = uStack_3c4;
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar14,auVar71);
    auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar14,auVar86);
    auVar83._8_8_ = uStack_2b8;
    auVar83._0_8_ = local_2c0;
    auVar83._16_8_ = uStack_2b0;
    auVar83._24_8_ = uStack_2a8;
    auVar225 = vfmadd231ps_fma(ZEXT1632(auVar225),auVar14,auVar83);
    auVar81._8_8_ = uStack_2d8;
    auVar81._0_8_ = local_2e0;
    auVar81._16_8_ = uStack_2d0;
    auVar81._24_8_ = uStack_2c8;
    auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar14,auVar81);
    auVar73._4_4_ = uStack_3bc;
    auVar73._0_4_ = local_3c0;
    auVar73._8_4_ = uStack_3b8;
    auVar73._12_4_ = uStack_3b4;
    auVar73._16_4_ = uStack_3b0;
    auVar73._20_4_ = uStack_3ac;
    auVar73._24_4_ = uStack_3a8;
    auVar73._28_4_ = uStack_3a4;
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar13,auVar73);
    auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar13,auVar88);
    auVar85._8_8_ = uStack_298;
    auVar85._0_8_ = local_2a0;
    auVar85._16_8_ = uStack_290;
    auVar85._24_8_ = uStack_288;
    auVar225 = vfmadd231ps_fma(ZEXT1632(auVar225),auVar13,auVar85);
    auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar87,auVar13);
    local_8c0._0_4_ = auVar7._0_4_ * fVar154;
    local_8c0._4_4_ = auVar7._4_4_ * fVar154;
    local_8c0._8_4_ = auVar7._8_4_ * fVar154;
    local_8c0._12_4_ = auVar7._12_4_ * fVar154;
    local_8c0._16_4_ = fVar154 * 0.0;
    local_8c0._20_4_ = fVar154 * 0.0;
    local_8c0._24_4_ = fVar154 * 0.0;
    local_8c0._28_4_ = 0;
    local_9a0._0_4_ = auVar133._0_4_ * fVar154;
    local_9a0._4_4_ = auVar133._4_4_ * fVar154;
    local_9a0._8_4_ = auVar133._8_4_ * fVar154;
    local_9a0._12_4_ = auVar133._12_4_ * fVar154;
    local_9a0._16_4_ = fVar154 * 0.0;
    local_9a0._20_4_ = fVar154 * 0.0;
    local_9a0._24_4_ = fVar154 * 0.0;
    local_9a0._28_4_ = 0;
    local_6e0._0_4_ = auVar225._0_4_ * fVar154;
    local_6e0._4_4_ = auVar225._4_4_ * fVar154;
    local_6e0._8_4_ = auVar225._8_4_ * fVar154;
    local_6e0._12_4_ = auVar225._12_4_ * fVar154;
    local_6e0._16_4_ = fVar154 * 0.0;
    local_6e0._20_4_ = fVar154 * 0.0;
    local_6e0._24_4_ = fVar154 * 0.0;
    local_6e0._28_4_ = 0;
    fVar195 = fVar154 * auVar99._0_4_;
    fVar204 = fVar154 * auVar99._4_4_;
    auVar20._4_4_ = fVar204;
    auVar20._0_4_ = fVar195;
    fVar205 = fVar154 * auVar99._8_4_;
    auVar20._8_4_ = fVar205;
    fVar237 = fVar154 * auVar99._12_4_;
    auVar20._12_4_ = fVar237;
    auVar20._16_4_ = fVar154 * 0.0;
    auVar20._20_4_ = fVar154 * 0.0;
    auVar20._24_4_ = fVar154 * 0.0;
    auVar20._28_4_ = fVar155;
    local_b00 = ZEXT1632(auVar106);
    local_b20 = vpermps_avx2(_DAT_0205d4a0,local_b00);
    _local_980 = vpermps_avx2(_DAT_0205d4a0,local_ae0);
    local_800 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar260));
    local_680 = vsubps_avx(local_b20,ZEXT1632(auVar106));
    local_660 = vsubps_avx(local_800,ZEXT1632(auVar260));
    fVar223 = local_660._0_4_;
    fVar232 = local_660._4_4_;
    auVar21._4_4_ = local_8c0._4_4_ * fVar232;
    auVar21._0_4_ = (float)local_8c0._0_4_ * fVar223;
    fVar234 = local_660._8_4_;
    auVar21._8_4_ = local_8c0._8_4_ * fVar234;
    fVar236 = local_660._12_4_;
    auVar21._12_4_ = local_8c0._12_4_ * fVar236;
    fVar217 = local_660._16_4_;
    auVar21._16_4_ = local_8c0._16_4_ * fVar217;
    fVar219 = local_660._20_4_;
    auVar21._20_4_ = local_8c0._20_4_ * fVar219;
    fVar221 = local_660._24_4_;
    auVar21._24_4_ = local_8c0._24_4_ * fVar221;
    auVar21._28_4_ = local_800._28_4_;
    auVar106 = vfmsub231ps_fma(auVar21,local_6e0,local_680);
    _local_6a0 = vsubps_avx(_local_980,local_ae0);
    fVar248 = local_680._0_4_;
    fVar285 = local_680._4_4_;
    auVar22._4_4_ = fVar285 * local_9a0._4_4_;
    auVar22._0_4_ = fVar248 * local_9a0._0_4_;
    fVar286 = local_680._8_4_;
    auVar22._8_4_ = fVar286 * local_9a0._8_4_;
    fVar287 = local_680._12_4_;
    auVar22._12_4_ = fVar287 * local_9a0._12_4_;
    fVar288 = local_680._16_4_;
    auVar22._16_4_ = fVar288 * local_9a0._16_4_;
    fVar289 = local_680._20_4_;
    auVar22._20_4_ = fVar289 * local_9a0._20_4_;
    fVar290 = local_680._24_4_;
    auVar22._24_4_ = fVar290 * local_9a0._24_4_;
    auVar22._28_4_ = local_980._28_4_;
    auVar7 = vfmsub231ps_fma(auVar22,local_8c0._0_32_,_local_6a0);
    auVar106 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar7._12_4_ * auVar7._12_4_,
                                                  CONCAT48(auVar7._8_4_ * auVar7._8_4_,
                                                           CONCAT44(auVar7._4_4_ * auVar7._4_4_,
                                                                    auVar7._0_4_ * auVar7._0_4_)))),
                               ZEXT1632(auVar106),ZEXT1632(auVar106));
    fVar231 = local_6a0._0_4_;
    auVar227._0_4_ = local_6e0._0_4_ * fVar231;
    fVar233 = local_6a0._4_4_;
    auVar227._4_4_ = local_6e0._4_4_ * fVar233;
    fVar235 = local_6a0._8_4_;
    auVar227._8_4_ = local_6e0._8_4_ * fVar235;
    fVar206 = local_6a0._12_4_;
    auVar227._12_4_ = local_6e0._12_4_ * fVar206;
    fVar218 = local_6a0._16_4_;
    auVar227._16_4_ = local_6e0._16_4_ * fVar218;
    fVar220 = local_6a0._20_4_;
    auVar227._20_4_ = local_6e0._20_4_ * fVar220;
    fVar222 = local_6a0._24_4_;
    auVar227._24_4_ = local_6e0._24_4_ * fVar222;
    auVar227._28_4_ = 0;
    auVar133 = vfmsub231ps_fma(auVar227,local_9a0,local_660);
    auVar189._0_4_ = fVar223 * fVar223;
    auVar189._4_4_ = fVar232 * fVar232;
    auVar189._8_4_ = fVar234 * fVar234;
    auVar189._12_4_ = fVar236 * fVar236;
    auVar189._16_4_ = fVar217 * fVar217;
    auVar189._20_4_ = fVar219 * fVar219;
    auVar189._24_4_ = fVar221 * fVar221;
    auVar189._28_4_ = 0;
    auVar7 = vfmadd231ps_fma(auVar189,_local_6a0,_local_6a0);
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),local_680,local_680);
    auVar121 = vrcpps_avx(ZEXT1632(auVar7));
    auVar133 = vfmadd231ps_fma(ZEXT1632(auVar106),ZEXT1632(auVar133),ZEXT1632(auVar133));
    auVar271._8_4_ = 0x3f800000;
    auVar271._0_8_ = &DAT_3f8000003f800000;
    auVar271._12_4_ = 0x3f800000;
    auVar271._16_4_ = 0x3f800000;
    auVar271._20_4_ = 0x3f800000;
    auVar271._24_4_ = 0x3f800000;
    auVar271._28_4_ = 0x3f800000;
    auVar106 = vfnmadd213ps_fma(auVar121,ZEXT1632(auVar7),auVar271);
    auVar106 = vfmadd132ps_fma(ZEXT1632(auVar106),auVar121,auVar121);
    local_9c0 = vpermps_avx2(_DAT_0205d4a0,local_8c0._0_32_);
    local_a20 = vpermps_avx2(_DAT_0205d4a0,local_6e0);
    auVar23._4_4_ = local_9c0._4_4_ * fVar232;
    auVar23._0_4_ = local_9c0._0_4_ * fVar223;
    auVar23._8_4_ = local_9c0._8_4_ * fVar234;
    auVar23._12_4_ = local_9c0._12_4_ * fVar236;
    auVar23._16_4_ = local_9c0._16_4_ * fVar217;
    auVar23._20_4_ = local_9c0._20_4_ * fVar219;
    auVar23._24_4_ = local_9c0._24_4_ * fVar221;
    auVar23._28_4_ = auVar121._28_4_;
    auVar225 = vfmsub231ps_fma(auVar23,local_a20,local_680);
    local_8e0 = vpermps_avx2(_DAT_0205d4a0,local_9a0);
    auVar24._4_4_ = fVar285 * local_8e0._4_4_;
    auVar24._0_4_ = fVar248 * local_8e0._0_4_;
    auVar24._8_4_ = fVar286 * local_8e0._8_4_;
    auVar24._12_4_ = fVar287 * local_8e0._12_4_;
    auVar24._16_4_ = fVar288 * local_8e0._16_4_;
    auVar24._20_4_ = fVar289 * local_8e0._20_4_;
    auVar24._24_4_ = fVar290 * local_8e0._24_4_;
    auVar24._28_4_ = 0;
    auVar99 = vfmsub231ps_fma(auVar24,local_9c0,_local_6a0);
    auVar225 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar99._12_4_ * auVar99._12_4_,
                                                  CONCAT48(auVar99._8_4_ * auVar99._8_4_,
                                                           CONCAT44(auVar99._4_4_ * auVar99._4_4_,
                                                                    auVar99._0_4_ * auVar99._0_4_)))
                                       ),ZEXT1632(auVar225),ZEXT1632(auVar225));
    fVar258 = local_a20._0_4_;
    auVar240._0_4_ = fVar258 * fVar231;
    fVar264 = local_a20._4_4_;
    auVar240._4_4_ = fVar264 * fVar233;
    fVar265 = local_a20._8_4_;
    auVar240._8_4_ = fVar265 * fVar235;
    fVar266 = local_a20._12_4_;
    auVar240._12_4_ = fVar266 * fVar206;
    fVar267 = local_a20._16_4_;
    auVar240._16_4_ = fVar267 * fVar218;
    fVar268 = local_a20._20_4_;
    auVar240._20_4_ = fVar268 * fVar220;
    fVar269 = local_a20._24_4_;
    auVar240._24_4_ = fVar269 * fVar222;
    auVar240._28_4_ = 0;
    auVar99 = vfmsub231ps_fma(auVar240,local_8e0,local_660);
    auVar225 = vfmadd231ps_fma(ZEXT1632(auVar225),ZEXT1632(auVar99),ZEXT1632(auVar99));
    auVar121 = vmaxps_avx(ZEXT1632(CONCAT412(auVar133._12_4_ * auVar106._12_4_,
                                             CONCAT48(auVar133._8_4_ * auVar106._8_4_,
                                                      CONCAT44(auVar133._4_4_ * auVar106._4_4_,
                                                               auVar133._0_4_ * auVar106._0_4_)))),
                          ZEXT1632(CONCAT412(auVar225._12_4_ * auVar106._12_4_,
                                             CONCAT48(auVar225._8_4_ * auVar106._8_4_,
                                                      CONCAT44(auVar225._4_4_ * auVar106._4_4_,
                                                               auVar225._0_4_ * auVar106._0_4_)))));
    local_840._0_4_ = auVar254._0_4_ + fVar195;
    local_840._4_4_ = auVar254._4_4_ + fVar204;
    local_840._8_4_ = auVar254._8_4_ + fVar205;
    local_840._12_4_ = auVar254._12_4_ + fVar237;
    local_840._16_4_ = fVar154 * 0.0 + 0.0;
    local_840._20_4_ = fVar154 * 0.0 + 0.0;
    local_840._24_4_ = fVar154 * 0.0 + 0.0;
    local_840._28_4_ = fVar155 + 0.0;
    local_920 = ZEXT1632(auVar254);
    auVar280 = vsubps_avx(local_920,auVar20);
    local_860 = vpermps_avx2(_DAT_0205d4a0,auVar280);
    local_820 = vpermps_avx2(_DAT_0205d4a0,local_920);
    auVar280 = vmaxps_avx(local_920,local_840);
    auVar12 = local_820;
    auVar111 = vmaxps_avx(local_860,local_820);
    auVar8 = vrsqrtps_avx(ZEXT1632(auVar7));
    auVar280 = vmaxps_avx(auVar280,auVar111);
    fVar154 = auVar8._0_4_;
    fVar155 = auVar8._4_4_;
    fVar195 = auVar8._8_4_;
    fVar204 = auVar8._12_4_;
    fVar205 = auVar8._16_4_;
    fVar237 = auVar8._20_4_;
    fVar246 = auVar8._24_4_;
    auVar251._0_4_ = fVar154 * fVar154 * fVar154 * auVar7._0_4_ * -0.5;
    auVar251._4_4_ = fVar155 * fVar155 * fVar155 * auVar7._4_4_ * -0.5;
    auVar251._8_4_ = fVar195 * fVar195 * fVar195 * auVar7._8_4_ * -0.5;
    auVar251._12_4_ = fVar204 * fVar204 * fVar204 * auVar7._12_4_ * -0.5;
    auVar251._16_4_ = fVar205 * fVar205 * fVar205 * -0.0;
    auVar251._20_4_ = fVar237 * fVar237 * fVar237 * -0.0;
    auVar251._24_4_ = fVar246 * fVar246 * fVar246 * -0.0;
    auVar251._28_4_ = 0;
    auVar113._8_4_ = 0x3fc00000;
    auVar113._0_8_ = 0x3fc000003fc00000;
    auVar113._12_4_ = 0x3fc00000;
    auVar113._16_4_ = 0x3fc00000;
    auVar113._20_4_ = 0x3fc00000;
    auVar113._24_4_ = 0x3fc00000;
    auVar113._28_4_ = 0x3fc00000;
    auVar106 = vfmadd231ps_fma(auVar251,auVar113,auVar8);
    fVar205 = auVar106._0_4_;
    fVar237 = auVar106._4_4_;
    auVar25._4_4_ = fVar237 * fVar233;
    auVar25._0_4_ = fVar205 * fVar231;
    fVar246 = auVar106._8_4_;
    auVar25._8_4_ = fVar246 * fVar235;
    fVar247 = auVar106._12_4_;
    auVar25._12_4_ = fVar247 * fVar206;
    auVar25._16_4_ = fVar218 * 0.0;
    auVar25._20_4_ = fVar220 * 0.0;
    auVar25._24_4_ = fVar222 * 0.0;
    auVar25._28_4_ = 0;
    auVar26._4_4_ = fVar237 * fVar232 * fStack_57c;
    auVar26._0_4_ = fVar205 * fVar223 * local_580;
    auVar26._8_4_ = fVar246 * fVar234 * fStack_578;
    auVar26._12_4_ = fVar247 * fVar236 * fStack_574;
    auVar26._16_4_ = fVar217 * 0.0 * fStack_570;
    auVar26._20_4_ = fVar219 * 0.0 * fStack_56c;
    auVar26._24_4_ = fVar221 * 0.0 * fStack_568;
    auVar26._28_4_ = local_8e0._28_4_;
    auVar106 = vfmadd231ps_fma(auVar26,auVar25,_local_560);
    auVar279 = ZEXT864(0) << 0x20;
    _local_780 = ZEXT1632(auVar260);
    auVar111 = vsubps_avx(ZEXT832(0) << 0x20,_local_780);
    fVar231 = auVar111._0_4_;
    auVar293._0_4_ = fVar205 * fVar223 * fVar231;
    fVar233 = auVar111._4_4_;
    auVar293._4_4_ = fVar237 * fVar232 * fVar233;
    fVar235 = auVar111._8_4_;
    auVar293._8_4_ = fVar246 * fVar234 * fVar235;
    fVar206 = auVar111._12_4_;
    auVar293._12_4_ = fVar247 * fVar236 * fVar206;
    fVar218 = auVar111._16_4_;
    auVar293._16_4_ = fVar217 * 0.0 * fVar218;
    fVar217 = auVar111._20_4_;
    auVar293._20_4_ = fVar219 * 0.0 * fVar217;
    fVar219 = auVar111._24_4_;
    auVar293._24_4_ = fVar221 * 0.0 * fVar219;
    auVar293._28_4_ = 0;
    auVar142 = vsubps_avx(ZEXT832(0) << 0x20,local_ae0);
    auVar262 = ZEXT3264(auVar142);
    auVar260 = vfmadd231ps_fma(auVar293,auVar142,auVar25);
    auVar27._4_4_ = fVar285 * fVar237;
    auVar27._0_4_ = fVar248 * fVar205;
    auVar27._8_4_ = fVar286 * fVar246;
    auVar27._12_4_ = fVar287 * fVar247;
    auVar27._16_4_ = fVar288 * 0.0;
    auVar27._20_4_ = fVar289 * 0.0;
    auVar27._24_4_ = fVar290 * 0.0;
    auVar27._28_4_ = 0;
    auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar27,_local_540);
    auVar272 = ZEXT832(0) << 0x20;
    auVar229 = vsubps_avx(auVar272,local_b00);
    auVar260 = vfmadd231ps_fma(ZEXT1632(auVar260),auVar229,auVar27);
    auVar28._4_4_ = fStack_57c * fVar233;
    auVar28._0_4_ = local_580 * fVar231;
    auVar28._8_4_ = fStack_578 * fVar235;
    auVar28._12_4_ = fStack_574 * fVar206;
    auVar28._16_4_ = fStack_570 * fVar218;
    auVar28._20_4_ = fStack_56c * fVar217;
    auVar28._24_4_ = fStack_568 * fVar219;
    auVar28._28_4_ = 0;
    auVar254 = vfmadd231ps_fma(auVar28,_local_560,auVar142);
    auVar254 = vfmadd231ps_fma(ZEXT1632(auVar254),_local_540,auVar229);
    fVar223 = auVar260._0_4_;
    fVar154 = auVar106._0_4_;
    fVar232 = auVar260._4_4_;
    fVar155 = auVar106._4_4_;
    fVar234 = auVar260._8_4_;
    fVar195 = auVar106._8_4_;
    fVar236 = auVar260._12_4_;
    fVar248 = auVar106._12_4_;
    auVar29._28_4_ = auVar8._28_4_;
    auVar29._0_28_ =
         ZEXT1628(CONCAT412(fVar248 * fVar236,
                            CONCAT48(fVar195 * fVar234,CONCAT44(fVar155 * fVar232,fVar154 * fVar223)
                                    )));
    auVar252 = vsubps_avx(ZEXT1632(auVar254),auVar29);
    auVar30._4_4_ = fVar233 * fVar233;
    auVar30._0_4_ = fVar231 * fVar231;
    auVar30._8_4_ = fVar235 * fVar235;
    auVar30._12_4_ = fVar206 * fVar206;
    auVar30._16_4_ = fVar218 * fVar218;
    auVar30._20_4_ = fVar217 * fVar217;
    auVar30._24_4_ = fVar219 * fVar219;
    auVar30._28_4_ = auVar8._28_4_;
    auVar254 = vfmadd231ps_fma(auVar30,auVar142,auVar142);
    auVar254 = vfmadd231ps_fma(ZEXT1632(auVar254),auVar229,auVar229);
    auVar31._28_4_ = local_680._28_4_;
    auVar31._0_28_ =
         ZEXT1628(CONCAT412(fVar236 * fVar236,
                            CONCAT48(fVar234 * fVar234,CONCAT44(fVar232 * fVar232,fVar223 * fVar223)
                                    )));
    auVar284 = ZEXT3264(auVar31);
    local_700 = vsubps_avx(ZEXT1632(auVar254),auVar31);
    local_760 = vsqrtps_avx(auVar121);
    fVar204 = local_760._28_4_ + auVar280._28_4_;
    fVar223 = (local_760._0_4_ + auVar280._0_4_) * 1.0000002;
    fVar232 = (local_760._4_4_ + auVar280._4_4_) * 1.0000002;
    fVar234 = (local_760._8_4_ + auVar280._8_4_) * 1.0000002;
    fVar236 = (local_760._12_4_ + auVar280._12_4_) * 1.0000002;
    fVar220 = (local_760._16_4_ + auVar280._16_4_) * 1.0000002;
    fVar221 = (local_760._20_4_ + auVar280._20_4_) * 1.0000002;
    fVar222 = (local_760._24_4_ + auVar280._24_4_) * 1.0000002;
    auVar32._4_4_ = fVar232 * fVar232;
    auVar32._0_4_ = fVar223 * fVar223;
    auVar32._8_4_ = fVar234 * fVar234;
    auVar32._12_4_ = fVar236 * fVar236;
    auVar32._16_4_ = fVar220 * fVar220;
    auVar32._20_4_ = fVar221 * fVar221;
    auVar32._24_4_ = fVar222 * fVar222;
    auVar32._28_4_ = fVar204;
    local_aa0._0_4_ = auVar252._0_4_ + auVar252._0_4_;
    local_aa0._4_4_ = auVar252._4_4_ + auVar252._4_4_;
    local_aa0._8_4_ = auVar252._8_4_ + auVar252._8_4_;
    local_aa0._12_4_ = auVar252._12_4_ + auVar252._12_4_;
    local_aa0._16_4_ = auVar252._16_4_ + auVar252._16_4_;
    local_aa0._20_4_ = auVar252._20_4_ + auVar252._20_4_;
    local_aa0._24_4_ = auVar252._24_4_ + auVar252._24_4_;
    local_aa0._28_4_ = auVar252._28_4_ + auVar252._28_4_;
    auVar280 = vsubps_avx(local_700,auVar32);
    auVar252 = ZEXT1632(auVar106);
    fStack_5a4 = fStack_564;
    _local_5c0 = ZEXT1628(CONCAT412(fVar248 * fVar248,
                                    CONCAT48(fVar195 * fVar195,
                                             CONCAT44(fVar155 * fVar155,fVar154 * fVar154))));
    local_6c0 = vsubps_avx(local_200,_local_5c0);
    local_720._4_4_ = local_aa0._4_4_ * local_aa0._4_4_;
    local_720._0_4_ = (float)local_aa0._0_4_ * (float)local_aa0._0_4_;
    fStack_718 = local_aa0._8_4_ * local_aa0._8_4_;
    fStack_714 = local_aa0._12_4_ * local_aa0._12_4_;
    fStack_710 = local_aa0._16_4_ * local_aa0._16_4_;
    fStack_70c = local_aa0._20_4_ * local_aa0._20_4_;
    fStack_708 = local_aa0._24_4_ * local_aa0._24_4_;
    fStack_704 = (float)auVar121._28_4_;
    fVar236 = local_6c0._0_4_;
    fVar232 = fVar236 * 4.0;
    fVar220 = local_6c0._4_4_;
    fVar234 = fVar220 * 4.0;
    fVar221 = local_6c0._8_4_;
    fStack_638 = fVar221 * 4.0;
    fVar222 = local_6c0._12_4_;
    fStack_634 = fVar222 * 4.0;
    fVar154 = local_6c0._16_4_;
    fStack_630 = fVar154 * 4.0;
    fVar155 = local_6c0._20_4_;
    fStack_62c = fVar155 * 4.0;
    fVar195 = local_6c0._24_4_;
    fStack_628 = fVar195 * 4.0;
    local_640 = CONCAT44(fVar234,fVar232);
    uStack_624 = 0x40800000;
    auVar33._4_4_ = fVar234 * auVar280._4_4_;
    auVar33._0_4_ = fVar232 * auVar280._0_4_;
    auVar33._8_4_ = fStack_638 * auVar280._8_4_;
    auVar33._12_4_ = fStack_634 * auVar280._12_4_;
    auVar33._16_4_ = fStack_630 * auVar280._16_4_;
    auVar33._20_4_ = fStack_62c * auVar280._20_4_;
    auVar33._24_4_ = fStack_628 * auVar280._24_4_;
    auVar33._28_4_ = fVar204;
    auVar8 = vsubps_avx(_local_720,auVar33);
    auVar121 = vcmpps_avx(auVar8,auVar272,5);
    auVar120 = ZEXT1632(auVar260);
    fVar223 = local_6c0._28_4_;
    if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar121 >> 0x7f,0) == '\0') &&
          (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar121 >> 0xbf,0) == '\0') &&
        (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar121[0x1f])
    {
      auVar194 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar114._8_4_ = 0xff800000;
      auVar114._0_8_ = 0xff800000ff800000;
      auVar114._12_4_ = 0xff800000;
      auVar114._16_4_ = 0xff800000;
      auVar114._20_4_ = 0xff800000;
      auVar114._24_4_ = 0xff800000;
      auVar114._28_4_ = 0xff800000;
    }
    else {
      auVar272 = vcmpps_avx(auVar8,auVar272,5);
      auVar216 = ZEXT3264(auVar272);
      auVar9 = vsqrtps_avx(auVar8);
      auVar281._0_4_ = fVar236 + fVar236;
      auVar281._4_4_ = fVar220 + fVar220;
      auVar281._8_4_ = fVar221 + fVar221;
      auVar281._12_4_ = fVar222 + fVar222;
      auVar281._16_4_ = fVar154 + fVar154;
      auVar281._20_4_ = fVar155 + fVar155;
      auVar281._24_4_ = fVar195 + fVar195;
      auVar281._28_4_ = fVar223 + fVar223;
      auVar8 = vrcpps_avx(auVar281);
      auVar115._8_4_ = 0x3f800000;
      auVar115._0_8_ = &DAT_3f8000003f800000;
      auVar115._12_4_ = 0x3f800000;
      auVar115._16_4_ = 0x3f800000;
      auVar115._20_4_ = 0x3f800000;
      auVar115._24_4_ = 0x3f800000;
      auVar115._28_4_ = 0x3f800000;
      auVar106 = vfnmadd213ps_fma(auVar281,auVar8,auVar115);
      auVar106 = vfmadd132ps_fma(ZEXT1632(auVar106),auVar8,auVar8);
      auVar273._0_4_ = local_aa0._0_4_ ^ local_620;
      auVar273._4_4_ = (uint)local_aa0._4_4_ ^ uStack_61c;
      auVar273._8_4_ = (uint)local_aa0._8_4_ ^ uStack_618;
      auVar273._12_4_ = (uint)local_aa0._12_4_ ^ uStack_614;
      auVar273._16_4_ = (uint)local_aa0._16_4_ ^ (uint)fStack_610;
      auVar273._20_4_ = (uint)local_aa0._20_4_ ^ (uint)fStack_60c;
      auVar273._24_4_ = (uint)local_aa0._24_4_ ^ (uint)fStack_608;
      auVar273._28_4_ = (uint)local_aa0._28_4_ ^ uStack_604;
      auVar8 = vsubps_avx(auVar273,auVar9);
      auVar34._4_4_ = auVar8._4_4_ * auVar106._4_4_;
      auVar34._0_4_ = auVar8._0_4_ * auVar106._0_4_;
      auVar34._8_4_ = auVar8._8_4_ * auVar106._8_4_;
      auVar34._12_4_ = auVar8._12_4_ * auVar106._12_4_;
      auVar34._16_4_ = auVar8._16_4_ * 0.0;
      auVar34._20_4_ = auVar8._20_4_ * 0.0;
      auVar34._24_4_ = auVar8._24_4_ * 0.0;
      auVar34._28_4_ = auVar8._28_4_;
      auVar8 = vsubps_avx(auVar9,local_aa0);
      auVar35._4_4_ = auVar106._4_4_ * auVar8._4_4_;
      auVar35._0_4_ = auVar106._0_4_ * auVar8._0_4_;
      auVar35._8_4_ = auVar106._8_4_ * auVar8._8_4_;
      auVar35._12_4_ = auVar106._12_4_ * auVar8._12_4_;
      auVar35._16_4_ = auVar8._16_4_ * 0.0;
      auVar35._20_4_ = auVar8._20_4_ * 0.0;
      auVar35._24_4_ = auVar8._24_4_ * 0.0;
      auVar35._28_4_ = auVar8._28_4_;
      auVar106 = vfmadd213ps_fma(auVar252,auVar34,auVar120);
      local_500 = ZEXT1632(CONCAT412(fVar247 * auVar106._12_4_,
                                     CONCAT48(fVar246 * auVar106._8_4_,
                                              CONCAT44(fVar237 * auVar106._4_4_,
                                                       fVar205 * auVar106._0_4_))));
      auVar106 = vfmadd213ps_fma(auVar252,auVar35,auVar120);
      local_520 = ZEXT1632(CONCAT412(fVar247 * auVar106._12_4_,
                                     CONCAT48(fVar246 * auVar106._8_4_,
                                              CONCAT44(fVar237 * auVar106._4_4_,
                                                       fVar205 * auVar106._0_4_))));
      auVar116._8_4_ = 0x7f800000;
      auVar116._0_8_ = 0x7f8000007f800000;
      auVar116._12_4_ = 0x7f800000;
      auVar116._16_4_ = 0x7f800000;
      auVar116._20_4_ = 0x7f800000;
      auVar116._24_4_ = 0x7f800000;
      auVar116._28_4_ = 0x7f800000;
      _local_880 = vblendvps_avx(auVar116,auVar34,auVar272);
      auVar63._4_4_ = uStack_79c;
      auVar63._0_4_ = local_7a0;
      auVar63._8_4_ = uStack_798;
      auVar63._12_4_ = uStack_794;
      auVar63._16_4_ = uStack_790;
      auVar63._20_4_ = uStack_78c;
      auVar63._24_4_ = uStack_788;
      auVar63._28_4_ = uStack_784;
      auVar8 = vandps_avx(auVar63,_local_5c0);
      auVar8 = vmaxps_avx(local_440,auVar8);
      auVar36._4_4_ = auVar8._4_4_ * 1.9073486e-06;
      auVar36._0_4_ = auVar8._0_4_ * 1.9073486e-06;
      auVar36._8_4_ = auVar8._8_4_ * 1.9073486e-06;
      auVar36._12_4_ = auVar8._12_4_ * 1.9073486e-06;
      auVar36._16_4_ = auVar8._16_4_ * 1.9073486e-06;
      auVar36._20_4_ = auVar8._20_4_ * 1.9073486e-06;
      auVar36._24_4_ = auVar8._24_4_ * 1.9073486e-06;
      auVar36._28_4_ = auVar8._28_4_;
      auVar8 = vandps_avx(auVar63,local_6c0);
      auVar279 = ZEXT3264(auVar8);
      auVar8 = vcmpps_avx(auVar8,auVar36,1);
      auVar284 = ZEXT3264(auVar8);
      auVar117._8_4_ = 0xff800000;
      auVar117._0_8_ = 0xff800000ff800000;
      auVar117._12_4_ = 0xff800000;
      auVar117._16_4_ = 0xff800000;
      auVar117._20_4_ = 0xff800000;
      auVar117._24_4_ = 0xff800000;
      auVar117._28_4_ = 0xff800000;
      auVar114 = vblendvps_avx(auVar117,auVar35,auVar272);
      auVar9 = auVar272 & auVar8;
      if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar9 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar9 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar9 >> 0x7f,0) == '\0') &&
            (auVar9 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar9 >> 0xbf,0) == '\0') &&
          (auVar9 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar9[0x1f]) {
        auVar194 = ZEXT3264(_local_880);
      }
      else {
        auVar121 = vandps_avx(auVar8,auVar272);
        auVar9 = vcmpps_avx(auVar280,_DAT_02020f00,2);
        auVar284 = ZEXT3264(auVar114);
        auVar214._8_4_ = 0xff800000;
        auVar214._0_8_ = 0xff800000ff800000;
        auVar214._12_4_ = 0xff800000;
        auVar214._16_4_ = 0xff800000;
        auVar214._20_4_ = 0xff800000;
        auVar214._24_4_ = 0xff800000;
        auVar214._28_4_ = 0xff800000;
        auVar125._8_4_ = 0x7f800000;
        auVar125._0_8_ = 0x7f8000007f800000;
        auVar125._12_4_ = 0x7f800000;
        auVar125._16_4_ = 0x7f800000;
        auVar125._20_4_ = 0x7f800000;
        auVar125._24_4_ = 0x7f800000;
        auVar125._28_4_ = 0x7f800000;
        auVar280 = vblendvps_avx(auVar125,auVar214,auVar9);
        auVar106 = vpackssdw_avx(auVar121._0_16_,auVar121._16_16_);
        auVar10 = vpmovsxwd_avx2(auVar106);
        auVar280 = vblendvps_avx(_local_880,auVar280,auVar10);
        auVar216 = ZEXT3264(auVar280);
        auVar277._8_4_ = 0xff800000;
        auVar277._0_8_ = 0xff800000ff800000;
        auVar277._12_4_ = 0xff800000;
        auVar277._16_4_ = 0xff800000;
        auVar277._20_4_ = 0xff800000;
        auVar277._24_4_ = 0xff800000;
        auVar277._28_4_ = 0xff800000;
        auVar8 = vblendvps_avx(auVar277,auVar125,auVar9);
        auVar279 = ZEXT3264(auVar8);
        auVar114 = vblendvps_avx(auVar114,auVar8,auVar10);
        auVar194 = ZEXT3264(auVar280);
        auVar203._0_8_ = auVar121._0_8_ ^ 0xffffffffffffffff;
        auVar203._8_4_ = auVar121._8_4_ ^ 0xffffffff;
        auVar203._12_4_ = auVar121._12_4_ ^ 0xffffffff;
        auVar203._16_4_ = auVar121._16_4_ ^ 0xffffffff;
        auVar203._20_4_ = auVar121._20_4_ ^ 0xffffffff;
        auVar203._24_4_ = auVar121._24_4_ ^ 0xffffffff;
        auVar203._28_4_ = auVar121._28_4_ ^ 0xffffffff;
        auVar121 = vorps_avx(auVar9,auVar203);
        auVar121 = vandps_avx(auVar272,auVar121);
      }
    }
    auVar245 = ZEXT3264(local_aa0);
    auVar280 = local_420 & auVar121;
    local_640 = uVar90;
    if ((((((((auVar280 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar280 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar280 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar280 >> 0x7f,0) != '\0') ||
          (auVar280 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar280 >> 0xbf,0) != '\0') ||
        (auVar280 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar280[0x1f] < '\0') {
      _local_880 = auVar114;
      fVar204 = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_7c0._0_4_;
      auVar190._4_4_ = fVar204;
      auVar190._0_4_ = fVar204;
      auVar190._8_4_ = fVar204;
      auVar190._12_4_ = fVar204;
      auVar190._16_4_ = fVar204;
      auVar190._20_4_ = fVar204;
      auVar190._24_4_ = fVar204;
      auVar190._28_4_ = fVar204;
      local_5a0 = vmaxps_avx(auVar190,auVar194._0_32_);
      auVar37._4_4_ = fVar233 * local_6e0._4_4_;
      auVar37._0_4_ = fVar231 * local_6e0._0_4_;
      auVar37._8_4_ = fVar235 * local_6e0._8_4_;
      auVar37._12_4_ = fVar206 * local_6e0._12_4_;
      auVar37._16_4_ = fVar218 * local_6e0._16_4_;
      auVar37._20_4_ = fVar217 * local_6e0._20_4_;
      auVar37._24_4_ = fVar219 * local_6e0._24_4_;
      auVar37._28_4_ = auVar111._28_4_;
      auVar106 = vfmadd213ps_fma(auVar142,local_9a0,auVar37);
      fVar231 = (ray->super_RayK<1>).tfar - (float)local_7c0._0_4_;
      auVar191._4_4_ = fVar231;
      auVar191._0_4_ = fVar231;
      auVar191._8_4_ = fVar231;
      auVar191._12_4_ = fVar231;
      auVar191._16_4_ = fVar231;
      auVar191._20_4_ = fVar231;
      auVar191._24_4_ = fVar231;
      auVar191._28_4_ = fVar231;
      auVar260 = vfmadd213ps_fma(auVar229,local_8c0._0_32_,ZEXT1632(auVar106));
      auVar216 = ZEXT3264(CONCAT428(fStack_564,
                                    CONCAT424(fStack_568,
                                              CONCAT420(fStack_56c,
                                                        CONCAT416(fStack_570,
                                                                  CONCAT412(fStack_574,
                                                                            CONCAT48(fStack_578,
                                                                                     CONCAT44(
                                                  fStack_57c,local_580))))))));
      auVar279._0_4_ = local_580 * local_6e0._0_4_;
      auVar279._4_4_ = fStack_57c * local_6e0._4_4_;
      auVar279._8_4_ = fStack_578 * local_6e0._8_4_;
      auVar279._12_4_ = fStack_574 * local_6e0._12_4_;
      auVar279._16_4_ = fStack_570 * local_6e0._16_4_;
      auVar279._20_4_ = fStack_56c * local_6e0._20_4_;
      auVar279._28_36_ = auVar194._28_36_;
      auVar279._24_4_ = fStack_568 * local_6e0._24_4_;
      auVar106 = vfmadd231ps_fma(auVar279._0_32_,_local_560,local_9a0);
      auVar254 = vfmadd231ps_fma(ZEXT1632(auVar106),_local_540,local_8c0._0_32_);
      auVar64._4_4_ = uStack_79c;
      auVar64._0_4_ = local_7a0;
      auVar64._8_4_ = uStack_798;
      auVar64._12_4_ = uStack_794;
      auVar64._16_4_ = uStack_790;
      auVar64._20_4_ = uStack_78c;
      auVar64._24_4_ = uStack_788;
      auVar64._28_4_ = uStack_784;
      auVar280 = vandps_avx(ZEXT1632(auVar254),auVar64);
      auVar118._8_4_ = 0x219392ef;
      auVar118._0_8_ = 0x219392ef219392ef;
      auVar118._12_4_ = 0x219392ef;
      auVar118._16_4_ = 0x219392ef;
      auVar118._20_4_ = 0x219392ef;
      auVar118._24_4_ = 0x219392ef;
      auVar118._28_4_ = 0x219392ef;
      auVar111 = vcmpps_avx(auVar280,auVar118,1);
      auVar280 = vrcpps_avx(ZEXT1632(auVar254));
      auVar296._8_4_ = 0x3f800000;
      auVar296._0_8_ = &DAT_3f8000003f800000;
      auVar296._12_4_ = 0x3f800000;
      auVar296._16_4_ = 0x3f800000;
      auVar296._20_4_ = 0x3f800000;
      auVar296._24_4_ = 0x3f800000;
      auVar296._28_4_ = 0x3f800000;
      auVar142 = ZEXT1632(auVar254);
      auVar106 = vfnmadd213ps_fma(auVar280,auVar142,auVar296);
      auVar106 = vfmadd132ps_fma(ZEXT1632(auVar106),auVar280,auVar280);
      auVar274._0_4_ = auVar254._0_4_ ^ local_620;
      auVar274._4_4_ = auVar254._4_4_ ^ uStack_61c;
      auVar274._8_4_ = auVar254._8_4_ ^ uStack_618;
      auVar274._12_4_ = auVar254._12_4_ ^ uStack_614;
      auVar274._16_4_ = fStack_610;
      auVar274._20_4_ = fStack_60c;
      auVar274._24_4_ = fStack_608;
      auVar274._28_4_ = uStack_604;
      auVar38._4_4_ = auVar106._4_4_ * (float)(auVar260._4_4_ ^ uStack_61c);
      auVar38._0_4_ = auVar106._0_4_ * (float)(auVar260._0_4_ ^ local_620);
      auVar38._8_4_ = auVar106._8_4_ * (float)(auVar260._8_4_ ^ uStack_618);
      auVar38._12_4_ = auVar106._12_4_ * (float)(auVar260._12_4_ ^ uStack_614);
      auVar38._16_4_ = fStack_610 * 0.0;
      auVar38._20_4_ = fStack_60c * 0.0;
      auVar38._24_4_ = fStack_608 * 0.0;
      auVar38._28_4_ = uStack_604;
      auVar280 = vcmpps_avx(auVar142,auVar274,1);
      auVar280 = vorps_avx(auVar111,auVar280);
      auVar297._8_4_ = 0xff800000;
      auVar297._0_8_ = 0xff800000ff800000;
      auVar297._12_4_ = 0xff800000;
      auVar297._16_4_ = 0xff800000;
      auVar297._20_4_ = 0xff800000;
      auVar297._24_4_ = 0xff800000;
      auVar297._28_4_ = 0xff800000;
      auVar280 = vblendvps_avx(auVar38,auVar297,auVar280);
      auVar8 = vminps_avx(auVar191,auVar114);
      local_8c0._0_32_ = vmaxps_avx(local_5a0,auVar280);
      auVar280 = vcmpps_avx(auVar142,auVar274,6);
      auVar280 = vorps_avx(auVar111,auVar280);
      auVar228._8_4_ = 0x7f800000;
      auVar228._0_8_ = 0x7f8000007f800000;
      auVar228._12_4_ = 0x7f800000;
      auVar228._16_4_ = 0x7f800000;
      auVar228._20_4_ = 0x7f800000;
      auVar228._24_4_ = 0x7f800000;
      auVar228._28_4_ = 0x7f800000;
      auVar280 = vblendvps_avx(auVar38,auVar228,auVar280);
      auVar8 = vminps_avx(auVar8,auVar280);
      auVar280 = vsubps_avx(ZEXT832(0) << 0x20,_local_980);
      auVar111 = vsubps_avx(ZEXT832(0) << 0x20,local_800);
      auVar39._4_4_ = auVar111._4_4_ * fVar264;
      auVar39._0_4_ = auVar111._0_4_ * fVar258;
      auVar39._8_4_ = auVar111._8_4_ * fVar265;
      auVar39._12_4_ = auVar111._12_4_ * fVar266;
      auVar39._16_4_ = auVar111._16_4_ * fVar267;
      auVar39._20_4_ = auVar111._20_4_ * fVar268;
      auVar39._24_4_ = auVar111._24_4_ * fVar269;
      auVar39._28_4_ = auVar111._28_4_;
      auVar106 = vfnmsub231ps_fma(auVar39,local_8e0,auVar280);
      auVar272 = ZEXT832(0) << 0x20;
      auVar280 = vsubps_avx(auVar272,local_b20);
      auVar260 = vfnmadd231ps_fma(ZEXT1632(auVar106),local_9c0,auVar280);
      auVar40._4_4_ = fVar264 * fStack_57c;
      auVar40._0_4_ = fVar258 * local_580;
      auVar40._8_4_ = fVar265 * fStack_578;
      auVar40._12_4_ = fVar266 * fStack_574;
      auVar40._16_4_ = fVar267 * fStack_570;
      auVar40._20_4_ = fVar268 * fStack_56c;
      auVar40._24_4_ = fVar269 * fStack_568;
      auVar40._28_4_ = auVar280._28_4_;
      auVar106 = vfnmsub231ps_fma(auVar40,_local_560,local_8e0);
      auVar254 = vfnmadd231ps_fma(ZEXT1632(auVar106),_local_540,local_9c0);
      auVar280 = vandps_avx(ZEXT1632(auVar254),auVar64);
      auVar142 = vrcpps_avx(ZEXT1632(auVar254));
      auVar141._8_4_ = 0x219392ef;
      auVar141._0_8_ = 0x219392ef219392ef;
      auVar141._12_4_ = 0x219392ef;
      auVar141._16_4_ = 0x219392ef;
      auVar141._20_4_ = 0x219392ef;
      auVar141._24_4_ = 0x219392ef;
      auVar141._28_4_ = 0x219392ef;
      auVar111 = vcmpps_avx(auVar280,auVar141,1);
      auVar262 = ZEXT3264(auVar111);
      auVar165._8_4_ = 0x3f800000;
      auVar165._0_8_ = &DAT_3f8000003f800000;
      auVar165._12_4_ = 0x3f800000;
      auVar165._16_4_ = 0x3f800000;
      auVar165._20_4_ = 0x3f800000;
      auVar165._24_4_ = 0x3f800000;
      auVar165._28_4_ = 0x3f800000;
      auVar229 = ZEXT1632(auVar254);
      auVar106 = vfnmadd213ps_fma(auVar142,auVar229,auVar165);
      auVar106 = vfmadd132ps_fma(ZEXT1632(auVar106),auVar142,auVar142);
      auVar275._0_4_ = auVar254._0_4_ ^ local_620;
      auVar275._4_4_ = auVar254._4_4_ ^ uStack_61c;
      auVar275._8_4_ = auVar254._8_4_ ^ uStack_618;
      auVar275._12_4_ = auVar254._12_4_ ^ uStack_614;
      auVar275._16_4_ = fStack_610;
      auVar275._20_4_ = fStack_60c;
      auVar275._24_4_ = fStack_608;
      auVar275._28_4_ = uStack_604;
      auVar279 = ZEXT3264(auVar275);
      auVar41._4_4_ = auVar106._4_4_ * (float)(auVar260._4_4_ ^ uStack_61c);
      auVar41._0_4_ = auVar106._0_4_ * (float)(auVar260._0_4_ ^ local_620);
      auVar41._8_4_ = auVar106._8_4_ * (float)(auVar260._8_4_ ^ uStack_618);
      auVar41._12_4_ = auVar106._12_4_ * (float)(auVar260._12_4_ ^ uStack_614);
      auVar41._16_4_ = fStack_610 * 0.0;
      auVar41._20_4_ = fStack_60c * 0.0;
      auVar41._24_4_ = fStack_608 * 0.0;
      auVar41._28_4_ = uStack_604;
      auVar245 = ZEXT3264(auVar41);
      auVar280 = vcmpps_avx(auVar229,auVar275,1);
      auVar280 = vorps_avx(auVar111,auVar280);
      auVar119._8_4_ = 0xff800000;
      auVar119._0_8_ = 0xff800000ff800000;
      auVar119._12_4_ = 0xff800000;
      auVar119._16_4_ = 0xff800000;
      auVar119._20_4_ = 0xff800000;
      auVar119._24_4_ = 0xff800000;
      auVar119._28_4_ = 0xff800000;
      auVar280 = vblendvps_avx(auVar41,auVar119,auVar280);
      auVar284 = ZEXT3264(auVar280);
      _local_880 = vmaxps_avx(local_8c0._0_32_,auVar280);
      auVar280 = vcmpps_avx(auVar229,auVar275,6);
      auVar280 = vorps_avx(auVar111,auVar280);
      auVar166._8_4_ = 0x7f800000;
      auVar166._0_8_ = 0x7f8000007f800000;
      auVar166._12_4_ = 0x7f800000;
      auVar166._16_4_ = 0x7f800000;
      auVar166._20_4_ = 0x7f800000;
      auVar166._24_4_ = 0x7f800000;
      auVar166._28_4_ = 0x7f800000;
      auVar280 = vblendvps_avx(auVar41,auVar166,auVar280);
      auVar121 = vandps_avx(auVar121,local_420);
      local_4a0 = vminps_avx(auVar8,auVar280);
      auVar280 = vcmpps_avx(_local_880,local_4a0,2);
      auVar111 = auVar121 & auVar280;
      if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar111 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar111 >> 0x7f,0) != '\0') ||
            (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar111 >> 0xbf,0) != '\0') ||
          (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar111[0x1f] < '\0') {
        auVar229 = _local_880;
        auVar111 = vminps_avx(local_500,auVar165);
        auVar54 = ZEXT812(0);
        auVar142 = ZEXT1232(auVar54) << 0x20;
        auVar111 = vmaxps_avx(auVar111,ZEXT1232(auVar54) << 0x20);
        auVar8 = vminps_avx(local_520,auVar165);
        auVar8 = vmaxps_avx(auVar8,ZEXT1232(auVar54) << 0x20);
        auVar42._4_4_ = (auVar111._4_4_ + 1.0) * 0.125;
        auVar42._0_4_ = (auVar111._0_4_ + 0.0) * 0.125;
        auVar42._8_4_ = (auVar111._8_4_ + 2.0) * 0.125;
        auVar42._12_4_ = (auVar111._12_4_ + 3.0) * 0.125;
        auVar42._16_4_ = (auVar111._16_4_ + 4.0) * 0.125;
        auVar42._20_4_ = (auVar111._20_4_ + 5.0) * 0.125;
        auVar42._24_4_ = (auVar111._24_4_ + 6.0) * 0.125;
        auVar42._28_4_ = auVar111._28_4_ + 7.0;
        auVar106 = vfmadd213ps_fma(auVar42,local_900,local_a40);
        auVar43._4_4_ = (auVar8._4_4_ + 1.0) * 0.125;
        auVar43._0_4_ = (auVar8._0_4_ + 0.0) * 0.125;
        auVar43._8_4_ = (auVar8._8_4_ + 2.0) * 0.125;
        auVar43._12_4_ = (auVar8._12_4_ + 3.0) * 0.125;
        auVar43._16_4_ = (auVar8._16_4_ + 4.0) * 0.125;
        auVar43._20_4_ = (auVar8._20_4_ + 5.0) * 0.125;
        auVar43._24_4_ = (auVar8._24_4_ + 6.0) * 0.125;
        auVar43._28_4_ = auVar8._28_4_ + 7.0;
        auVar260 = vfmadd213ps_fma(auVar43,local_900,local_a40);
        auVar111 = vminps_avx(local_920,local_840);
        auVar8 = vminps_avx(local_860,local_820);
        auVar111 = vminps_avx(auVar111,auVar8);
        auVar111 = vsubps_avx(auVar111,local_760);
        auVar121 = vandps_avx(auVar280,auVar121);
        local_500 = ZEXT1632(auVar106);
        local_520 = ZEXT1632(auVar260);
        auVar44._4_4_ = auVar111._4_4_ * 0.99999976;
        auVar44._0_4_ = auVar111._0_4_ * 0.99999976;
        auVar44._8_4_ = auVar111._8_4_ * 0.99999976;
        auVar44._12_4_ = auVar111._12_4_ * 0.99999976;
        auVar44._16_4_ = auVar111._16_4_ * 0.99999976;
        auVar44._20_4_ = auVar111._20_4_ * 0.99999976;
        auVar44._24_4_ = auVar111._24_4_ * 0.99999976;
        auVar44._28_4_ = auVar111._28_4_;
        auVar280 = vmaxps_avx(auVar272,auVar44);
        auVar45._4_4_ = auVar280._4_4_ * auVar280._4_4_;
        auVar45._0_4_ = auVar280._0_4_ * auVar280._0_4_;
        auVar45._8_4_ = auVar280._8_4_ * auVar280._8_4_;
        auVar45._12_4_ = auVar280._12_4_ * auVar280._12_4_;
        auVar45._16_4_ = auVar280._16_4_ * auVar280._16_4_;
        auVar45._20_4_ = auVar280._20_4_ * auVar280._20_4_;
        auVar45._24_4_ = auVar280._24_4_ * auVar280._24_4_;
        auVar45._28_4_ = auVar280._28_4_;
        auVar111 = vsubps_avx(local_700,auVar45);
        auVar46._4_4_ = auVar111._4_4_ * fVar234;
        auVar46._0_4_ = auVar111._0_4_ * fVar232;
        auVar46._8_4_ = auVar111._8_4_ * fStack_638;
        auVar46._12_4_ = auVar111._12_4_ * fStack_634;
        auVar46._16_4_ = auVar111._16_4_ * fStack_630;
        auVar46._20_4_ = auVar111._20_4_ * fStack_62c;
        auVar46._24_4_ = auVar111._24_4_ * fStack_628;
        auVar46._28_4_ = auVar280._28_4_;
        auVar8 = vsubps_avx(_local_720,auVar46);
        auVar280 = vcmpps_avx(auVar8,ZEXT1232(auVar54) << 0x20,5);
        auVar216 = ZEXT3264(auVar280);
        if ((((((((auVar280 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar280 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar280 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar280 >> 0x7f,0) == '\0') &&
              (auVar280 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar280 >> 0xbf,0) == '\0') &&
            (auVar280 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar280[0x1f]) {
          auVar120 = SUB6432(ZEXT864(0),0) << 0x20;
          local_660 = ZEXT832(0) << 0x20;
          local_680 = ZEXT832(0) << 0x20;
          _local_6a0 = ZEXT832(0) << 0x20;
          auVar194 = ZEXT864(0) << 0x20;
          auVar230._8_4_ = 0x7f800000;
          auVar230._0_8_ = 0x7f8000007f800000;
          auVar230._12_4_ = 0x7f800000;
          auVar230._16_4_ = 0x7f800000;
          auVar230._20_4_ = 0x7f800000;
          auVar230._24_4_ = 0x7f800000;
          auVar230._28_4_ = 0x7f800000;
          auVar245 = ZEXT3264(CONCAT428(0xff800000,
                                        CONCAT424(0xff800000,
                                                  CONCAT420(0xff800000,
                                                            CONCAT416(0xff800000,
                                                                      CONCAT412(0xff800000,
                                                                                CONCAT48(0xff800000,
                                                                                                                                                                                  
                                                  0xff800000ff800000)))))));
        }
        else {
          _local_980 = auVar280;
          local_b20 = auVar121;
          auVar9 = vsqrtps_avx(auVar8);
          auVar241._0_4_ = fVar236 + fVar236;
          auVar241._4_4_ = fVar220 + fVar220;
          auVar241._8_4_ = fVar221 + fVar221;
          auVar241._12_4_ = fVar222 + fVar222;
          auVar241._16_4_ = fVar154 + fVar154;
          auVar241._20_4_ = fVar155 + fVar155;
          auVar241._24_4_ = fVar195 + fVar195;
          auVar241._28_4_ = fVar223 + fVar223;
          auVar142 = vrcpps_avx(auVar241);
          auVar106 = vfnmadd213ps_fma(auVar241,auVar142,auVar165);
          auVar106 = vfmadd132ps_fma(ZEXT1632(auVar106),auVar142,auVar142);
          auVar276._0_4_ = local_aa0._0_4_ ^ local_620;
          auVar276._4_4_ = (uint)local_aa0._4_4_ ^ uStack_61c;
          auVar276._8_4_ = (uint)local_aa0._8_4_ ^ uStack_618;
          auVar276._12_4_ = (uint)local_aa0._12_4_ ^ uStack_614;
          auVar276._16_4_ = (uint)local_aa0._16_4_ ^ (uint)fStack_610;
          auVar276._20_4_ = (uint)local_aa0._20_4_ ^ (uint)fStack_60c;
          auVar276._24_4_ = (uint)local_aa0._24_4_ ^ (uint)fStack_608;
          auVar276._28_4_ = (uint)local_aa0._28_4_ ^ uStack_604;
          auVar142 = vsubps_avx(auVar276,auVar9);
          auVar10 = vsubps_avx(auVar9,local_aa0);
          fVar223 = auVar142._0_4_ * auVar106._0_4_;
          fVar231 = auVar142._4_4_ * auVar106._4_4_;
          auVar47._4_4_ = fVar231;
          auVar47._0_4_ = fVar223;
          fVar232 = auVar142._8_4_ * auVar106._8_4_;
          auVar47._8_4_ = fVar232;
          fVar233 = auVar142._12_4_ * auVar106._12_4_;
          auVar47._12_4_ = fVar233;
          fVar234 = auVar142._16_4_ * 0.0;
          auVar47._16_4_ = fVar234;
          fVar235 = auVar142._20_4_ * 0.0;
          auVar47._20_4_ = fVar235;
          fVar236 = auVar142._24_4_ * 0.0;
          auVar47._24_4_ = fVar236;
          auVar47._28_4_ = auVar9._28_4_;
          fVar206 = auVar10._0_4_ * auVar106._0_4_;
          fVar217 = auVar10._4_4_ * auVar106._4_4_;
          auVar48._4_4_ = fVar217;
          auVar48._0_4_ = fVar206;
          fVar218 = auVar10._8_4_ * auVar106._8_4_;
          auVar48._8_4_ = fVar218;
          fVar219 = auVar10._12_4_ * auVar106._12_4_;
          auVar48._12_4_ = fVar219;
          fVar220 = auVar10._16_4_ * 0.0;
          auVar48._16_4_ = fVar220;
          fVar221 = auVar10._20_4_ * 0.0;
          auVar48._20_4_ = fVar221;
          fVar222 = auVar10._24_4_ * 0.0;
          auVar48._24_4_ = fVar222;
          auVar48._28_4_ = auVar142._28_4_;
          auVar106 = vfmadd213ps_fma(auVar252,auVar47,auVar120);
          auVar260 = vfmadd213ps_fma(auVar252,auVar48,auVar120);
          auVar142 = ZEXT1632(CONCAT412(fVar247 * auVar106._12_4_,
                                        CONCAT48(fVar246 * auVar106._8_4_,
                                                 CONCAT44(fVar237 * auVar106._4_4_,
                                                          fVar205 * auVar106._0_4_))));
          auVar252 = ZEXT1632(CONCAT412(fVar247 * auVar260._12_4_,
                                        CONCAT48(fVar246 * auVar260._8_4_,
                                                 CONCAT44(fVar237 * auVar260._4_4_,
                                                          fVar205 * auVar260._0_4_))));
          auVar106 = vfmadd213ps_fma(local_680,auVar142,local_b00);
          auVar260 = vfmadd213ps_fma(local_680,auVar252,local_b00);
          auVar254 = vfmadd213ps_fma(_local_6a0,auVar142,local_ae0);
          auVar7 = vfmadd213ps_fma(_local_6a0,auVar252,local_ae0);
          auVar133 = vfmadd213ps_fma(auVar142,local_660,_local_780);
          auVar225 = vfmadd213ps_fma(local_660,auVar252,_local_780);
          auVar49._4_4_ = (float)local_540._4_4_ * fVar231;
          auVar49._0_4_ = (float)local_540._0_4_ * fVar223;
          auVar49._8_4_ = fStack_538 * fVar232;
          auVar49._12_4_ = fStack_534 * fVar233;
          auVar49._16_4_ = fStack_530 * fVar234;
          auVar49._20_4_ = fStack_52c * fVar235;
          auVar49._24_4_ = fStack_528 * fVar236;
          auVar49._28_4_ = 0;
          auVar120 = vsubps_avx(auVar49,ZEXT1632(auVar106));
          auVar143._0_4_ = (float)local_560._0_4_ * fVar223;
          auVar143._4_4_ = (float)local_560._4_4_ * fVar231;
          auVar143._8_4_ = fStack_558 * fVar232;
          auVar143._12_4_ = fStack_554 * fVar233;
          auVar143._16_4_ = fStack_550 * fVar234;
          auVar143._20_4_ = fStack_54c * fVar235;
          auVar143._24_4_ = fStack_548 * fVar236;
          auVar143._28_4_ = 0;
          auVar142 = vsubps_avx(auVar143,ZEXT1632(auVar254));
          auVar167._0_4_ = local_580 * fVar223;
          auVar167._4_4_ = fStack_57c * fVar231;
          auVar167._8_4_ = fStack_578 * fVar232;
          auVar167._12_4_ = fStack_574 * fVar233;
          auVar167._16_4_ = fStack_570 * fVar234;
          auVar167._20_4_ = fStack_56c * fVar235;
          auVar167._24_4_ = fStack_568 * fVar236;
          auVar167._28_4_ = 0;
          auVar252 = vsubps_avx(auVar167,ZEXT1632(auVar133));
          auVar194 = ZEXT3264(auVar252);
          auVar242._0_4_ = (float)local_540._0_4_ * fVar206;
          auVar242._4_4_ = (float)local_540._4_4_ * fVar217;
          auVar242._8_4_ = fStack_538 * fVar218;
          auVar242._12_4_ = fStack_534 * fVar219;
          auVar242._16_4_ = fStack_530 * fVar220;
          auVar242._20_4_ = fStack_52c * fVar221;
          auVar242._24_4_ = fStack_528 * fVar222;
          auVar242._28_4_ = 0;
          local_660 = vsubps_avx(auVar242,ZEXT1632(auVar260));
          auVar50._4_4_ = fVar217 * (float)local_560._4_4_;
          auVar50._0_4_ = fVar206 * (float)local_560._0_4_;
          auVar50._8_4_ = fVar218 * fStack_558;
          auVar50._12_4_ = fVar219 * fStack_554;
          auVar50._16_4_ = fVar220 * fStack_550;
          auVar50._20_4_ = fVar221 * fStack_54c;
          auVar50._24_4_ = fVar222 * fStack_548;
          auVar50._28_4_ = local_660._28_4_;
          local_680 = vsubps_avx(auVar50,ZEXT1632(auVar7));
          auVar51._4_4_ = fStack_57c * fVar217;
          auVar51._0_4_ = local_580 * fVar206;
          auVar51._8_4_ = fStack_578 * fVar218;
          auVar51._12_4_ = fStack_574 * fVar219;
          auVar51._16_4_ = fStack_570 * fVar220;
          auVar51._20_4_ = fStack_56c * fVar221;
          auVar51._24_4_ = fStack_568 * fVar222;
          auVar51._28_4_ = local_680._28_4_;
          _local_6a0 = vsubps_avx(auVar51,ZEXT1632(auVar225));
          auVar252 = vcmpps_avx(auVar8,auVar272,5);
          auVar243._8_4_ = 0x7f800000;
          auVar243._0_8_ = 0x7f8000007f800000;
          auVar243._12_4_ = 0x7f800000;
          auVar243._16_4_ = 0x7f800000;
          auVar243._20_4_ = 0x7f800000;
          auVar243._24_4_ = 0x7f800000;
          auVar243._28_4_ = 0x7f800000;
          auVar230 = vblendvps_avx(auVar243,auVar47,auVar252);
          auVar65._4_4_ = uStack_79c;
          auVar65._0_4_ = local_7a0;
          auVar65._8_4_ = uStack_798;
          auVar65._12_4_ = uStack_794;
          auVar65._16_4_ = uStack_790;
          auVar65._20_4_ = uStack_78c;
          auVar65._24_4_ = uStack_788;
          auVar65._28_4_ = uStack_784;
          auVar8 = vandps_avx(auVar65,_local_5c0);
          auVar8 = vmaxps_avx(local_440,auVar8);
          auVar52._4_4_ = auVar8._4_4_ * 1.9073486e-06;
          auVar52._0_4_ = auVar8._0_4_ * 1.9073486e-06;
          auVar52._8_4_ = auVar8._8_4_ * 1.9073486e-06;
          auVar52._12_4_ = auVar8._12_4_ * 1.9073486e-06;
          auVar52._16_4_ = auVar8._16_4_ * 1.9073486e-06;
          auVar52._20_4_ = auVar8._20_4_ * 1.9073486e-06;
          auVar52._24_4_ = auVar8._24_4_ * 1.9073486e-06;
          auVar52._28_4_ = auVar8._28_4_;
          auVar8 = vandps_avx(auVar65,local_6c0);
          auVar272 = vcmpps_avx(auVar8,auVar52,1);
          auVar244._8_4_ = 0xff800000;
          auVar244._0_8_ = 0xff800000ff800000;
          auVar244._12_4_ = 0xff800000;
          auVar244._16_4_ = 0xff800000;
          auVar244._20_4_ = 0xff800000;
          auVar244._24_4_ = 0xff800000;
          auVar244._28_4_ = 0xff800000;
          auVar8 = vblendvps_avx(auVar244,auVar48,auVar252);
          auVar245 = ZEXT3264(auVar8);
          auVar9 = auVar252 & auVar272;
          if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar9 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar9 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar9 >> 0x7f,0) == '\0') &&
                (auVar9 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar9 >> 0xbf,0) == '\0') &&
              (auVar9 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar9[0x1f]) {
            auVar216 = ZEXT3264(auVar280);
          }
          else {
            auVar280 = vandps_avx(auVar272,auVar252);
            auVar272 = vcmpps_avx(auVar111,ZEXT832(0) << 0x20,2);
            auVar278._8_4_ = 0xff800000;
            auVar278._0_8_ = 0xff800000ff800000;
            auVar278._12_4_ = 0xff800000;
            auVar278._16_4_ = 0xff800000;
            auVar278._20_4_ = 0xff800000;
            auVar278._24_4_ = 0xff800000;
            auVar278._28_4_ = 0xff800000;
            auVar283._8_4_ = 0x7f800000;
            auVar283._0_8_ = 0x7f8000007f800000;
            auVar283._12_4_ = 0x7f800000;
            auVar283._16_4_ = 0x7f800000;
            auVar283._20_4_ = 0x7f800000;
            auVar283._24_4_ = 0x7f800000;
            auVar283._28_4_ = 0x7f800000;
            auVar111 = vblendvps_avx(auVar283,auVar278,auVar272);
            auVar106 = vpackssdw_avx(auVar280._0_16_,auVar280._16_16_);
            auVar9 = vpmovsxwd_avx2(auVar106);
            auVar230 = vblendvps_avx(auVar230,auVar111,auVar9);
            auVar111 = vblendvps_avx(auVar278,auVar283,auVar272);
            auVar111 = vblendvps_avx(auVar8,auVar111,auVar9);
            auVar245 = ZEXT3264(auVar111);
            auVar215._0_8_ = auVar280._0_8_ ^ 0xffffffffffffffff;
            auVar215._8_4_ = auVar280._8_4_ ^ 0xffffffff;
            auVar215._12_4_ = auVar280._12_4_ ^ 0xffffffff;
            auVar215._16_4_ = auVar280._16_4_ ^ 0xffffffff;
            auVar215._20_4_ = auVar280._20_4_ ^ 0xffffffff;
            auVar215._24_4_ = auVar280._24_4_ ^ 0xffffffff;
            auVar215._28_4_ = auVar280._28_4_ ^ 0xffffffff;
            auVar280 = vorps_avx(auVar272,auVar215);
            auVar280 = vandps_avx(auVar252,auVar280);
            auVar216 = ZEXT3264(auVar280);
          }
        }
        uVar93 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
        auVar257._4_4_ = uVar93;
        auVar257._0_4_ = uVar93;
        auVar257._8_4_ = uVar93;
        auVar257._12_4_ = uVar93;
        auVar257._16_4_ = uVar93;
        auVar257._20_4_ = uVar93;
        auVar257._24_4_ = uVar93;
        auVar257._28_4_ = uVar93;
        uVar93 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
        auVar261._4_4_ = uVar93;
        auVar261._0_4_ = uVar93;
        auVar261._8_4_ = uVar93;
        auVar261._12_4_ = uVar93;
        auVar261._16_4_ = uVar93;
        auVar261._20_4_ = uVar93;
        auVar261._24_4_ = uVar93;
        auVar261._28_4_ = uVar93;
        auVar262 = ZEXT3264(auVar261);
        fVar223 = (ray->super_RayK<1>).dir.field_0.m128[2];
        auVar282._4_4_ = fVar223;
        auVar282._0_4_ = fVar223;
        auVar282._8_4_ = fVar223;
        auVar282._12_4_ = fVar223;
        auVar282._16_4_ = fVar223;
        auVar282._20_4_ = fVar223;
        auVar282._24_4_ = fVar223;
        auVar282._28_4_ = fVar223;
        auVar284 = ZEXT3264(auVar282);
        local_480 = _local_880;
        local_460 = vminps_avx(local_4a0,auVar230);
        _local_4c0 = vmaxps_avx(_local_880,auVar245._0_32_);
        auVar279 = ZEXT3264(_local_4c0);
        auVar280 = vcmpps_avx(_local_880,local_460,2);
        local_5a0 = vandps_avx(auVar280,auVar121);
        local_5e0 = local_5a0;
        auVar280 = vcmpps_avx(_local_4c0,local_4a0,2);
        local_600 = vandps_avx(auVar280,auVar121);
        auVar121 = vorps_avx(local_600,local_5a0);
        if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar121 >> 0x7f,0) != '\0') ||
              (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar121 >> 0xbf,0) != '\0') ||
            (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar121[0x1f] < '\0') {
          local_240 = local_600;
          _local_5c0 = _local_4c0;
          local_260._0_8_ = auVar216._0_8_ ^ 0xffffffffffffffff;
          local_260._8_4_ = auVar216._8_4_ ^ 0xffffffff;
          local_260._12_4_ = auVar216._12_4_ ^ 0xffffffff;
          local_260._16_4_ = auVar216._16_4_ ^ 0xffffffff;
          local_260._20_4_ = auVar216._20_4_ ^ 0xffffffff;
          local_260._24_4_ = auVar216._24_4_ ^ 0xffffffff;
          local_260._28_4_ = auVar216._28_4_ ^ 0xffffffff;
          auVar245 = ZEXT3264(auVar282);
          auVar172._0_4_ = fVar223 * auVar194._0_4_;
          auVar172._4_4_ = fVar223 * auVar194._4_4_;
          auVar172._8_4_ = fVar223 * auVar194._8_4_;
          auVar172._12_4_ = fVar223 * auVar194._12_4_;
          auVar172._16_4_ = fVar223 * auVar194._16_4_;
          auVar172._20_4_ = fVar223 * auVar194._20_4_;
          auVar172._28_36_ = auVar194._28_36_;
          auVar172._24_4_ = fVar223 * auVar194._24_4_;
          auVar279 = ZEXT3264(auVar261);
          auVar106 = vfmadd213ps_fma(auVar142,auVar261,auVar172._0_32_);
          auVar262 = ZEXT3264(auVar257);
          auVar106 = vfmadd213ps_fma(auVar120,auVar257,ZEXT1632(auVar106));
          auVar66._4_4_ = uStack_79c;
          auVar66._0_4_ = local_7a0;
          auVar66._8_4_ = uStack_798;
          auVar66._12_4_ = uStack_794;
          auVar66._16_4_ = uStack_790;
          auVar66._20_4_ = uStack_78c;
          auVar66._24_4_ = uStack_788;
          auVar66._28_4_ = uStack_784;
          auVar121 = vandps_avx(ZEXT1632(auVar106),auVar66);
          auVar144._8_4_ = 0x3e99999a;
          auVar144._0_8_ = 0x3e99999a3e99999a;
          auVar144._12_4_ = 0x3e99999a;
          auVar144._16_4_ = 0x3e99999a;
          auVar144._20_4_ = 0x3e99999a;
          auVar144._24_4_ = 0x3e99999a;
          auVar144._28_4_ = 0x3e99999a;
          auVar121 = vcmpps_avx(auVar121,auVar144,1);
          auVar121 = vorps_avx(auVar121,local_260);
          auVar145._8_4_ = 3;
          auVar145._0_8_ = 0x300000003;
          auVar145._12_4_ = 3;
          auVar145._16_4_ = 3;
          auVar145._20_4_ = 3;
          auVar145._24_4_ = 3;
          auVar145._28_4_ = 3;
          auVar168._8_4_ = 2;
          auVar168._0_8_ = 0x200000002;
          auVar168._12_4_ = 2;
          auVar168._16_4_ = 2;
          auVar168._20_4_ = 2;
          auVar168._24_4_ = 2;
          auVar168._28_4_ = 2;
          auVar121 = vblendvps_avx(auVar168,auVar145,auVar121);
          uVar93 = (undefined4)uVar90;
          local_280._4_4_ = uVar93;
          local_280._0_4_ = uVar93;
          local_280._8_4_ = uVar93;
          local_280._12_4_ = uVar93;
          local_280._16_4_ = uVar93;
          local_280._20_4_ = uVar93;
          local_280._24_4_ = uVar93;
          local_280._28_4_ = uVar93;
          local_6c0 = vpcmpgtd_avx2(auVar121,local_280);
          local_5e0 = vpandn_avx2(local_6c0,local_5a0);
          auVar194 = ZEXT3264(local_5e0);
          auVar121 = local_5a0 & ~local_6c0;
          if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar121 >> 0x7f,0) != '\0') ||
                (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar121 >> 0xbf,0) != '\0') ||
              (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar121[0x1f] < '\0') {
            auVar260 = vminps_avx(local_9d0,local_9f0);
            auVar106 = vmaxps_avx(local_9d0,local_9f0);
            auVar254 = vminps_avx(local_9e0,_local_a00);
            auVar7 = vminps_avx(auVar260,auVar254);
            auVar260 = vmaxps_avx(local_9e0,_local_a00);
            auVar254 = vmaxps_avx(auVar106,auVar260);
            auVar106 = vandps_avx(auVar7,local_890);
            auVar260 = vandps_avx(auVar254,local_890);
            auVar106 = vmaxps_avx(auVar106,auVar260);
            auVar260 = vmovshdup_avx(auVar106);
            auVar260 = vmaxss_avx(auVar260,auVar106);
            auVar106 = vshufpd_avx(auVar106,auVar106,1);
            auVar106 = vmaxss_avx(auVar106,auVar260);
            local_8c0._0_4_ = auVar106._0_4_ * 1.9073486e-06;
            auVar106 = vshufps_avx(auVar254,auVar254,0xff);
            local_760._0_16_ = auVar106;
            local_780._4_4_ = (float)local_880._4_4_ + (float)local_740._4_4_;
            local_780._0_4_ = (float)local_880._0_4_ + (float)local_740._0_4_;
            fStack_778 = fStack_878 + fStack_738;
            fStack_774 = fStack_874 + fStack_734;
            fStack_770 = fStack_870 + fStack_730;
            fStack_76c = fStack_86c + fStack_72c;
            fStack_768 = fStack_868 + fStack_728;
            fStack_764 = fStack_864 + fStack_724;
            local_920 = auVar257;
            local_840 = auVar261;
            local_860 = auVar282;
            _local_880 = auVar229;
            local_820 = auVar12;
            do {
              auVar146._8_4_ = 0x7f800000;
              auVar146._0_8_ = 0x7f8000007f800000;
              auVar146._12_4_ = 0x7f800000;
              auVar146._16_4_ = 0x7f800000;
              auVar146._20_4_ = 0x7f800000;
              auVar146._24_4_ = 0x7f800000;
              auVar146._28_4_ = 0x7f800000;
              auVar121 = auVar194._0_32_;
              auVar280 = vblendvps_avx(auVar146,_local_880,auVar121);
              auVar111 = vshufps_avx(auVar280,auVar280,0xb1);
              auVar111 = vminps_avx(auVar280,auVar111);
              auVar8 = vshufpd_avx(auVar111,auVar111,5);
              auVar111 = vminps_avx(auVar111,auVar8);
              auVar8 = vpermpd_avx2(auVar111,0x4e);
              auVar111 = vminps_avx(auVar111,auVar8);
              auVar280 = vcmpps_avx(auVar280,auVar111,0);
              auVar111 = auVar121 & auVar280;
              if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar111 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar111 >> 0x7f,0) != '\0') ||
                    (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar111 >> 0xbf,0) != '\0') ||
                  (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar111[0x1f] < '\0') {
                auVar121 = vandps_avx(auVar280,auVar121);
              }
              uVar89 = vmovmskps_avx(auVar121);
              iVar11 = 0;
              for (; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x80000000) {
                iVar11 = iVar11 + 1;
              }
              uVar89 = iVar11 << 2;
              *(undefined4 *)(local_5e0 + uVar89) = 0;
              aVar2 = (ray->super_RayK<1>).dir.field_0;
              local_800._0_16_ = (undefined1  [16])aVar2;
              auVar106 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
              auVar284 = ZEXT464(*(uint *)(local_500 + uVar89));
              if (auVar106._0_4_ < 0.0) {
                local_ae0._0_16_ = ZEXT416(*(uint *)(local_500 + uVar89));
                local_b00._0_16_ = ZEXT416((uint)*(float *)(local_480 + uVar89));
                fVar231 = sqrtf(auVar106._0_4_);
                auVar284 = ZEXT1664(local_ae0._0_16_);
                fVar223 = (float)local_b00._0_4_;
                uVar93 = local_b00._4_4_;
                uVar294 = local_b00._8_4_;
                uVar295 = local_b00._12_4_;
              }
              else {
                auVar106 = vsqrtss_avx(auVar106,auVar106);
                fVar231 = auVar106._0_4_;
                fVar223 = *(float *)(local_480 + uVar89);
                uVar93 = 0;
                uVar294 = 0;
                uVar295 = 0;
              }
              local_900._0_4_ = fVar231 * 1.9073486e-06;
              lVar94 = 4;
              do {
                auVar121 = local_b00;
                auVar101._4_4_ = fVar223;
                auVar101._0_4_ = fVar223;
                auVar101._8_4_ = fVar223;
                auVar101._12_4_ = fVar223;
                auVar260 = vfmadd213ps_fma(auVar101,local_800._0_16_,_DAT_01feba10);
                fVar235 = auVar284._0_4_;
                fVar236 = 1.0 - fVar235;
                local_9a0._0_16_ = ZEXT416((uint)fVar236);
                fVar231 = fVar235 * fVar235;
                auVar99 = SUB6416(ZEXT464(0x40400000),0);
                auVar225 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar133 = auVar284._0_16_;
                auVar254 = vfmadd213ss_fma(auVar99,auVar133,auVar225);
                auVar106 = vfmadd213ss_fma(auVar254,ZEXT416((uint)fVar231),
                                           SUB6416(ZEXT464(0x40000000),0));
                auVar7 = vfmadd213ss_fma(auVar99,ZEXT416((uint)fVar236),auVar225);
                auVar7 = vfmadd213ss_fma(auVar7,ZEXT416((uint)(fVar236 * fVar236)),
                                         SUB6416(ZEXT464(0x40000000),0));
                fVar232 = fVar236 * fVar236 * -fVar235 * 0.5;
                fVar233 = auVar106._0_4_ * 0.5;
                fVar234 = auVar7._0_4_ * 0.5;
                fVar235 = fVar235 * fVar235 * -fVar236 * 0.5;
                auVar174._0_4_ = fVar235 * (float)local_a00._0_4_;
                auVar174._4_4_ = fVar235 * (float)local_a00._4_4_;
                auVar174._8_4_ = fVar235 * fStack_9f8;
                auVar174._12_4_ = fVar235 * fStack_9f4;
                auVar198._4_4_ = fVar234;
                auVar198._0_4_ = fVar234;
                auVar198._8_4_ = fVar234;
                auVar198._12_4_ = fVar234;
                auVar106 = vfmadd132ps_fma(auVar198,auVar174,local_9e0);
                auVar157._4_4_ = fVar233;
                auVar157._0_4_ = fVar233;
                auVar157._8_4_ = fVar233;
                auVar157._12_4_ = fVar233;
                auVar106 = vfmadd132ps_fma(auVar157,auVar106,local_9f0);
                auVar175._4_4_ = fVar232;
                auVar175._0_4_ = fVar232;
                auVar175._8_4_ = fVar232;
                auVar175._12_4_ = fVar232;
                auVar106 = vfmadd132ps_fma(auVar175,auVar106,local_9d0);
                local_a40._0_16_ = vfmadd231ss_fma(auVar225,auVar133,ZEXT416(0x41100000));
                auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar133,ZEXT416(0x40800000)
                                        );
                local_9c0._0_16_ = auVar7;
                local_6e0._0_16_ = auVar106;
                auVar106 = vsubps_avx(auVar260,auVar106);
                _local_980 = auVar106;
                auVar106 = vdpps_avx(auVar106,auVar106,0x7f);
                auVar260 = vfmadd213ss_fma(auVar99,auVar133,ZEXT416(0xbf800000));
                local_a20._0_16_ = auVar260;
                local_ae0._0_16_ = auVar133;
                local_b00._4_4_ = uVar93;
                local_b00._0_4_ = fVar223;
                local_b00._8_4_ = uVar294;
                local_b00._16_16_ = auVar121._16_16_;
                local_b00._12_4_ = uVar295;
                local_b20._0_16_ = auVar106;
                if (auVar106._0_4_ < 0.0) {
                  local_8e0._0_4_ = auVar254._0_4_;
                  local_aa0._0_4_ = fVar231;
                  local_820._0_4_ = fVar236 * -2.0;
                  local_9a0._0_16_ = ZEXT416((uint)fVar236);
                  auVar284._0_4_ = sqrtf(auVar106._0_4_);
                  auVar284._4_60_ = extraout_var;
                  auVar254 = ZEXT416((uint)local_8e0._0_4_);
                  auVar106 = auVar284._0_16_;
                  fVar232 = (float)local_820._0_4_;
                  auVar133 = local_ae0._0_16_;
                  fVar223 = (float)local_b00._0_4_;
                }
                else {
                  auVar106 = vsqrtss_avx(auVar106,auVar106);
                  fVar232 = fVar236 * -2.0;
                  local_aa0._0_4_ = fVar231;
                }
                fVar231 = local_9a0._0_4_;
                fVar233 = auVar133._0_4_;
                auVar260 = vfmadd213ss_fma(auVar254,ZEXT416((uint)(fVar233 + fVar233)),
                                           ZEXT416((uint)(fVar233 * fVar233 * 3.0)));
                auVar99 = SUB6416(ZEXT464(0x40000000),0);
                auVar254 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar133,auVar99);
                auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar231 * fVar231 * -3.0)),
                                         ZEXT416((uint)(fVar231 + fVar231)),auVar254);
                auVar225 = vfnmadd231ss_fma(ZEXT416((uint)(fVar233 * (fVar231 + fVar231))),
                                            local_9a0._0_16_,local_9a0._0_16_);
                auVar254 = vfmadd213ss_fma(ZEXT416((uint)fVar232),auVar133,
                                           ZEXT416((uint)local_aa0._0_4_));
                fVar231 = auVar225._0_4_ * 0.5;
                fVar232 = auVar260._0_4_ * 0.5;
                fVar233 = auVar7._0_4_ * 0.5;
                fVar234 = auVar254._0_4_ * 0.5;
                auVar176._0_4_ = (float)local_a00._0_4_ * fVar234;
                auVar176._4_4_ = (float)local_a00._4_4_ * fVar234;
                auVar176._8_4_ = fStack_9f8 * fVar234;
                auVar176._12_4_ = fStack_9f4 * fVar234;
                auVar158._4_4_ = fVar233;
                auVar158._0_4_ = fVar233;
                auVar158._8_4_ = fVar233;
                auVar158._12_4_ = fVar233;
                auVar260 = vfmadd213ps_fma(auVar158,local_9e0,auVar176);
                auVar130._4_4_ = fVar232;
                auVar130._0_4_ = fVar232;
                auVar130._8_4_ = fVar232;
                auVar130._12_4_ = fVar232;
                auVar260 = vfmadd213ps_fma(auVar130,local_9f0,auVar260);
                auVar255._4_4_ = fVar231;
                auVar255._0_4_ = fVar231;
                auVar255._8_4_ = fVar231;
                auVar255._12_4_ = fVar231;
                local_9a0._0_16_ = vfmadd213ps_fma(auVar255,local_9d0,auVar260);
                auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar133,auVar99);
                auVar102._0_4_ = (float)local_a00._0_4_ * (float)local_a20._0_4_;
                auVar102._4_4_ = (float)local_a00._4_4_ * (float)local_a20._0_4_;
                auVar102._8_4_ = fStack_9f8 * (float)local_a20._0_4_;
                auVar102._12_4_ = fStack_9f4 * (float)local_a20._0_4_;
                auVar159._4_4_ = local_9c0._0_4_;
                auVar159._0_4_ = local_9c0._0_4_;
                auVar159._8_4_ = local_9c0._0_4_;
                auVar159._12_4_ = local_9c0._0_4_;
                auVar260 = vfmadd213ps_fma(auVar159,local_9e0,auVar102);
                uVar93 = local_a40._0_4_;
                auVar177._4_4_ = uVar93;
                auVar177._0_4_ = uVar93;
                auVar177._8_4_ = uVar93;
                auVar177._12_4_ = uVar93;
                auVar260 = vfmadd213ps_fma(auVar177,local_9f0,auVar260);
                auVar254 = vdpps_avx(local_9a0._0_16_,local_9a0._0_16_,0x7f);
                auVar131._0_4_ = auVar7._0_4_;
                auVar131._4_4_ = auVar131._0_4_;
                auVar131._8_4_ = auVar131._0_4_;
                auVar131._12_4_ = auVar131._0_4_;
                auVar133 = vfmadd213ps_fma(auVar131,local_9d0,auVar260);
                auVar260 = vblendps_avx(auVar254,_DAT_01feba10,0xe);
                auVar7 = vrsqrtss_avx(auVar260,auVar260);
                fVar233 = auVar254._0_4_;
                fVar231 = auVar7._0_4_;
                auVar7 = vdpps_avx(local_9a0._0_16_,auVar133,0x7f);
                fVar231 = fVar231 * 1.5 + fVar233 * -0.5 * fVar231 * fVar231 * fVar231;
                auVar132._0_4_ = auVar133._0_4_ * fVar233;
                auVar132._4_4_ = auVar133._4_4_ * fVar233;
                auVar132._8_4_ = auVar133._8_4_ * fVar233;
                auVar132._12_4_ = auVar133._12_4_ * fVar233;
                fVar232 = auVar7._0_4_;
                auVar212._0_4_ = local_9a0._0_4_ * fVar232;
                auVar212._4_4_ = local_9a0._4_4_ * fVar232;
                fVar234 = local_9a0._8_4_;
                auVar212._8_4_ = fVar234 * fVar232;
                fVar235 = local_9a0._12_4_;
                auVar212._12_4_ = fVar235 * fVar232;
                auVar7 = vsubps_avx(auVar132,auVar212);
                auVar260 = vrcpss_avx(auVar260,auVar260);
                auVar133 = vfnmadd213ss_fma(auVar260,auVar254,auVar99);
                fVar232 = auVar260._0_4_ * auVar133._0_4_;
                auVar260 = vmaxss_avx(ZEXT416((uint)local_8c0._0_4_),
                                      ZEXT416((uint)(fVar223 * (float)local_900._0_4_)));
                auVar250._0_8_ = local_9a0._0_8_ ^ 0x8000000080000000;
                auVar250._8_4_ = -fVar234;
                auVar250._12_4_ = -fVar235;
                local_a40._0_4_ = fVar231 * auVar7._0_4_ * fVar232;
                local_a40._4_4_ = fVar231 * auVar7._4_4_ * fVar232;
                local_a40._8_4_ = fVar231 * auVar7._8_4_ * fVar232;
                local_a40._12_4_ = fVar231 * auVar7._12_4_ * fVar232;
                local_aa0._0_4_ = local_9a0._0_4_ * fVar231;
                local_aa0._4_4_ = local_9a0._4_4_ * fVar231;
                local_aa0._8_4_ = fVar234 * fVar231;
                local_aa0._12_4_ = fVar235 * fVar231;
                local_9c0._0_4_ = auVar260._0_4_;
                if (fVar233 < -fVar233) {
                  local_a20._0_4_ = auVar106._0_4_;
                  local_8e0._0_16_ = auVar250;
                  fVar223 = sqrtf(fVar233);
                  auVar260 = ZEXT416((uint)local_9c0._0_4_);
                  auVar106 = ZEXT416((uint)local_a20._0_4_);
                  auVar250 = local_8e0._0_16_;
                }
                else {
                  auVar254 = vsqrtss_avx(auVar254,auVar254);
                  fVar223 = auVar254._0_4_;
                }
                local_a20._0_16_ = vdpps_avx(_local_980,local_aa0._0_16_,0x7f);
                auVar225 = vfmadd213ss_fma(ZEXT416((uint)local_8c0._0_4_),auVar106,auVar260);
                auVar254 = vdpps_avx(auVar250,local_aa0._0_16_,0x7f);
                auVar7 = vdpps_avx(_local_980,local_a40._0_16_,0x7f);
                auVar133 = vdpps_avx(local_800._0_16_,local_aa0._0_16_,0x7f);
                auVar106 = vfmadd213ss_fma(ZEXT416((uint)(auVar106._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_8c0._0_4_ / fVar223)),
                                           auVar225);
                local_8e0._0_4_ = auVar106._0_4_;
                auVar103._0_4_ = local_a20._0_4_ * local_a20._0_4_;
                auVar103._4_4_ = local_a20._4_4_ * local_a20._4_4_;
                auVar103._8_4_ = local_a20._8_4_ * local_a20._8_4_;
                auVar103._12_4_ = local_a20._12_4_ * local_a20._12_4_;
                auVar106 = vdpps_avx(_local_980,auVar250,0x7f);
                auVar99 = vsubps_avx(local_b20._0_16_,auVar103);
                auVar225 = vrsqrtss_avx(auVar99,auVar99);
                fVar231 = auVar99._0_4_;
                fVar223 = auVar225._0_4_;
                fVar223 = fVar223 * 1.5 + fVar231 * -0.5 * fVar223 * fVar223 * fVar223;
                auVar225 = vdpps_avx(_local_980,local_800._0_16_,0x7f);
                local_aa0._0_16_ = ZEXT416((uint)(auVar254._0_4_ + auVar7._0_4_));
                local_a40._0_16_ = vfnmadd231ss_fma(auVar106,local_a20._0_16_,local_aa0._0_16_);
                auVar106 = vfnmadd231ss_fma(auVar225,local_a20._0_16_,auVar133);
                if (fVar231 < 0.0) {
                  local_820._0_16_ = auVar133;
                  local_700._0_4_ = fVar223;
                  _local_720 = auVar106;
                  fVar231 = sqrtf(fVar231);
                  auVar260 = ZEXT416((uint)local_9c0._0_4_);
                  fVar223 = (float)local_700._0_4_;
                  auVar106 = _local_720;
                  auVar133 = local_820._0_16_;
                }
                else {
                  auVar254 = vsqrtss_avx(auVar99,auVar99);
                  fVar231 = auVar254._0_4_;
                }
                auVar262 = ZEXT3264(local_920);
                auVar279 = ZEXT3264(local_840);
                auVar245 = ZEXT3264(local_860);
                auVar254 = vpermilps_avx(local_6e0._0_16_,0xff);
                auVar225 = vshufps_avx(local_9a0._0_16_,local_9a0._0_16_,0xff);
                auVar7 = vfmsub213ss_fma(local_a40._0_16_,ZEXT416((uint)fVar223),auVar225);
                auVar178._0_8_ = auVar133._0_8_ ^ 0x8000000080000000;
                auVar178._8_4_ = auVar133._8_4_ ^ 0x80000000;
                auVar178._12_4_ = auVar133._12_4_ ^ 0x80000000;
                auVar199._0_8_ = auVar7._0_8_ ^ 0x8000000080000000;
                auVar199._8_4_ = auVar7._8_4_ ^ 0x80000000;
                auVar199._12_4_ = auVar7._12_4_ ^ 0x80000000;
                auVar106 = ZEXT416((uint)(auVar106._0_4_ * fVar223));
                auVar7 = vfmsub231ss_fma(ZEXT416((uint)(auVar133._0_4_ * auVar7._0_4_)),
                                         local_aa0._0_16_,auVar106);
                auVar106 = vinsertps_avx(auVar106,auVar178,0x10);
                uVar93 = auVar7._0_4_;
                auVar179._4_4_ = uVar93;
                auVar179._0_4_ = uVar93;
                auVar179._8_4_ = uVar93;
                auVar179._12_4_ = uVar93;
                auVar106 = vdivps_avx(auVar106,auVar179);
                auVar133 = ZEXT416((uint)(fVar231 - auVar254._0_4_));
                auVar7 = vinsertps_avx(local_a20._0_16_,auVar133,0x10);
                auVar216 = ZEXT1664(auVar7);
                auVar160._0_4_ = auVar7._0_4_ * auVar106._0_4_;
                auVar160._4_4_ = auVar7._4_4_ * auVar106._4_4_;
                auVar160._8_4_ = auVar7._8_4_ * auVar106._8_4_;
                auVar160._12_4_ = auVar7._12_4_ * auVar106._12_4_;
                auVar106 = vinsertps_avx(auVar199,local_aa0._0_16_,0x1c);
                auVar106 = vdivps_avx(auVar106,auVar179);
                auVar180._0_4_ = auVar7._0_4_ * auVar106._0_4_;
                auVar180._4_4_ = auVar7._4_4_ * auVar106._4_4_;
                auVar180._8_4_ = auVar7._8_4_ * auVar106._8_4_;
                auVar180._12_4_ = auVar7._12_4_ * auVar106._12_4_;
                auVar106 = vhaddps_avx(auVar160,auVar160);
                auVar254 = vhaddps_avx(auVar180,auVar180);
                fVar231 = (float)local_ae0._0_4_ - auVar106._0_4_;
                auVar284 = ZEXT464((uint)fVar231);
                fVar223 = (float)local_b00._0_4_ - auVar254._0_4_;
                uVar93 = 0;
                uVar294 = 0;
                uVar295 = 0;
                auVar106 = vandps_avx(local_a20._0_16_,local_890);
                if ((float)local_8e0._0_4_ <= auVar106._0_4_) {
LAB_016b37b7:
                  bVar53 = false;
                }
                else {
                  auVar260 = vfmadd231ss_fma(ZEXT416((uint)(auVar260._0_4_ + (float)local_8e0._0_4_)
                                                    ),local_760._0_16_,ZEXT416(0x36000000));
                  auVar106 = vandps_avx(auVar133,local_890);
                  if (auVar260._0_4_ <= auVar106._0_4_) goto LAB_016b37b7;
                  fVar223 = fVar223 + (float)local_7c0._0_4_;
                  uVar93 = 0;
                  uVar294 = 0;
                  uVar295 = 0;
                  bVar53 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar223) &&
                       (fVar232 = (ray->super_RayK<1>).tfar, fVar223 <= fVar232)) &&
                      (0.0 <= fVar231)) && (fVar231 <= 1.0)) {
                    auVar106 = vrsqrtss_avx(local_b20._0_16_,local_b20._0_16_);
                    fVar233 = auVar106._0_4_;
                    pGVar5 = (context->scene->geometries).items[local_b28].ptr;
                    if ((pGVar5->mask & (ray->super_RayK<1>).mask) != 0) {
                      fVar233 = fVar233 * 1.5 + local_b20._0_4_ * -0.5 * fVar233 * fVar233 * fVar233
                      ;
                      auVar134._0_4_ = fVar233 * (float)local_980._0_4_;
                      auVar134._4_4_ = fVar233 * (float)local_980._4_4_;
                      auVar134._8_4_ = fVar233 * fStack_978;
                      auVar134._12_4_ = fVar233 * fStack_974;
                      auVar133 = vfmadd213ps_fma(auVar225,auVar134,local_9a0._0_16_);
                      auVar106 = vshufps_avx(auVar134,auVar134,0xc9);
                      auVar260 = vshufps_avx(local_9a0._0_16_,local_9a0._0_16_,0xc9);
                      auVar135._0_4_ = auVar134._0_4_ * auVar260._0_4_;
                      auVar135._4_4_ = auVar134._4_4_ * auVar260._4_4_;
                      auVar135._8_4_ = auVar134._8_4_ * auVar260._8_4_;
                      auVar135._12_4_ = auVar134._12_4_ * auVar260._12_4_;
                      auVar254 = vfmsub231ps_fma(auVar135,local_9a0._0_16_,auVar106);
                      auVar106 = vshufps_avx(auVar254,auVar254,0xc9);
                      auVar260 = vshufps_avx(auVar133,auVar133,0xc9);
                      auVar254 = vshufps_avx(auVar254,auVar254,0xd2);
                      auVar104._0_4_ = auVar133._0_4_ * auVar254._0_4_;
                      auVar104._4_4_ = auVar133._4_4_ * auVar254._4_4_;
                      auVar104._8_4_ = auVar133._8_4_ * auVar254._8_4_;
                      auVar104._12_4_ = auVar133._12_4_ * auVar254._12_4_;
                      auVar106 = vfmsub231ps_fma(auVar104,auVar106,auVar260);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar223;
                        auVar260 = vshufps_avx(auVar106,auVar106,0xe9);
                        uVar1 = vmovlps_avx(auVar260);
                        *(undefined8 *)&(ray->Ng).field_0 = uVar1;
                        (ray->Ng).field_0.field_0.z = auVar106._0_4_;
                        ray->u = fVar231;
                        ray->v = 0.0;
                        ray->primID = (uint)local_aa8;
                        ray->geomID = (uint)local_b28;
                        ray->instID[0] = context->user->instID[0];
                        ray->instPrimID[0] = context->user->instPrimID[0];
                      }
                      else {
                        auVar260 = vshufps_avx(auVar106,auVar106,0xe9);
                        local_950 = vmovlps_avx(auVar260);
                        local_948 = auVar106._0_4_;
                        local_944 = fVar231;
                        local_940 = 0;
                        local_93c = (uint)local_aa8;
                        local_938 = (uint)local_b28;
                        local_934 = context->user->instID[0];
                        local_930 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar223;
                        local_b2c = -1;
                        local_a70.valid = &local_b2c;
                        local_a70.geometryUserPtr = pGVar5->userPtr;
                        local_a70.context = context->user;
                        local_a70.ray = (RTCRayN *)ray;
                        local_a70.hit = (RTCHitN *)&local_950;
                        local_a70.N = 1;
                        local_ae0._0_16_ = ZEXT416((uint)fVar231);
                        local_b00._0_16_ = ZEXT416((uint)fVar223);
                        local_b20._0_4_ = fVar232;
                        if (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_016b38fc:
                          p_Var6 = context->args->filter;
                          if (p_Var6 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
                              auVar216 = ZEXT1664(auVar216._0_16_);
                              (*p_Var6)(&local_a70);
                              auVar284 = ZEXT1664(local_ae0._0_16_);
                              auVar245 = ZEXT3264(local_860);
                              auVar279 = ZEXT3264(local_840);
                              auVar262 = ZEXT3264(local_920);
                              fVar232 = (float)local_b20._0_4_;
                              fVar223 = (float)local_b00._0_4_;
                              uVar93 = local_b00._4_4_;
                              uVar294 = local_b00._8_4_;
                              uVar295 = local_b00._12_4_;
                            }
                            if (*local_a70.valid == 0) goto LAB_016b39bd;
                          }
                          (((Vec3f *)((long)local_a70.ray + 0x30))->field_0).components[0] =
                               *(float *)local_a70.hit;
                          (((Vec3f *)((long)local_a70.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_a70.hit + 4);
                          (((Vec3f *)((long)local_a70.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_a70.hit + 8);
                          *(float *)((long)local_a70.ray + 0x3c) = *(float *)(local_a70.hit + 0xc);
                          *(float *)((long)local_a70.ray + 0x40) = *(float *)(local_a70.hit + 0x10);
                          *(float *)((long)local_a70.ray + 0x44) = *(float *)(local_a70.hit + 0x14);
                          *(float *)((long)local_a70.ray + 0x48) = *(float *)(local_a70.hit + 0x18);
                          *(float *)((long)local_a70.ray + 0x4c) = *(float *)(local_a70.hit + 0x1c);
                          *(float *)((long)local_a70.ray + 0x50) = *(float *)(local_a70.hit + 0x20);
                        }
                        else {
                          auVar216 = ZEXT1664(auVar7);
                          (*pGVar5->intersectionFilterN)(&local_a70);
                          auVar284 = ZEXT1664(local_ae0._0_16_);
                          auVar245 = ZEXT3264(local_860);
                          auVar279 = ZEXT3264(local_840);
                          auVar262 = ZEXT3264(local_920);
                          fVar232 = (float)local_b20._0_4_;
                          fVar223 = (float)local_b00._0_4_;
                          uVar93 = local_b00._4_4_;
                          uVar294 = local_b00._8_4_;
                          uVar295 = local_b00._12_4_;
                          if (*local_a70.valid != 0) goto LAB_016b38fc;
LAB_016b39bd:
                          (ray->super_RayK<1>).tfar = fVar232;
                        }
                      }
                    }
                  }
                }
                auVar121 = local_5e0;
                bVar95 = lVar94 != 0;
                lVar94 = lVar94 + -1;
              } while ((!bVar53) && (bVar95));
              fVar223 = (ray->super_RayK<1>).tfar;
              auVar122._4_4_ = fVar223;
              auVar122._0_4_ = fVar223;
              auVar122._8_4_ = fVar223;
              auVar122._12_4_ = fVar223;
              auVar122._16_4_ = fVar223;
              auVar122._20_4_ = fVar223;
              auVar122._24_4_ = fVar223;
              auVar122._28_4_ = fVar223;
              auVar280 = vcmpps_avx(_local_780,auVar122,2);
              local_5e0 = vandps_avx(auVar280,local_5e0);
              auVar194 = ZEXT3264(local_5e0);
              auVar121 = auVar121 & auVar280;
            } while ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar121 >> 0x7f,0) != '\0') ||
                       (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar121 >> 0xbf,0) != '\0') ||
                     (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar121[0x1f] < '\0');
          }
          auVar126._0_4_ = auVar245._0_4_ * (float)local_6a0._0_4_;
          auVar126._4_4_ = auVar245._4_4_ * (float)local_6a0._4_4_;
          auVar126._8_4_ = auVar245._8_4_ * fStack_698;
          auVar126._12_4_ = auVar245._12_4_ * fStack_694;
          auVar126._16_4_ = auVar245._16_4_ * fStack_690;
          auVar126._20_4_ = auVar245._20_4_ * fStack_68c;
          auVar126._28_36_ = auVar194._28_36_;
          auVar126._24_4_ = auVar245._24_4_ * fStack_688;
          auVar106 = vfmadd213ps_fma(local_680,auVar279._0_32_,auVar126._0_32_);
          auVar106 = vfmadd213ps_fma(local_660,auVar262._0_32_,ZEXT1632(auVar106));
          auVar67._4_4_ = uStack_79c;
          auVar67._0_4_ = local_7a0;
          auVar67._8_4_ = uStack_798;
          auVar67._12_4_ = uStack_794;
          auVar67._16_4_ = uStack_790;
          auVar67._20_4_ = uStack_78c;
          auVar67._24_4_ = uStack_788;
          auVar67._28_4_ = uStack_784;
          auVar121 = vandps_avx(ZEXT1632(auVar106),auVar67);
          auVar147._8_4_ = 0x3e99999a;
          auVar147._0_8_ = 0x3e99999a3e99999a;
          auVar147._12_4_ = 0x3e99999a;
          auVar147._16_4_ = 0x3e99999a;
          auVar147._20_4_ = 0x3e99999a;
          auVar147._24_4_ = 0x3e99999a;
          auVar147._28_4_ = 0x3e99999a;
          auVar121 = vcmpps_avx(auVar121,auVar147,1);
          auVar280 = vorps_avx(auVar121,local_260);
          auVar148._0_4_ = (float)local_5c0._0_4_ + (float)local_740._0_4_;
          auVar148._4_4_ = (float)local_5c0._4_4_ + (float)local_740._4_4_;
          auVar148._8_4_ = fStack_5b8 + fStack_738;
          auVar148._12_4_ = fStack_5b4 + fStack_734;
          auVar148._16_4_ = fStack_5b0 + fStack_730;
          auVar148._20_4_ = fStack_5ac + fStack_72c;
          auVar148._24_4_ = fStack_5a8 + fStack_728;
          auVar148._28_4_ = fStack_5a4 + fStack_724;
          fVar223 = (ray->super_RayK<1>).tfar;
          auVar169._4_4_ = fVar223;
          auVar169._0_4_ = fVar223;
          auVar169._8_4_ = fVar223;
          auVar169._12_4_ = fVar223;
          auVar169._16_4_ = fVar223;
          auVar169._20_4_ = fVar223;
          auVar169._24_4_ = fVar223;
          auVar169._28_4_ = fVar223;
          auVar121 = vcmpps_avx(auVar148,auVar169,2);
          local_760 = vandps_avx(auVar121,local_240);
          auVar149._8_4_ = 3;
          auVar149._0_8_ = 0x300000003;
          auVar149._12_4_ = 3;
          auVar149._16_4_ = 3;
          auVar149._20_4_ = 3;
          auVar149._24_4_ = 3;
          auVar149._28_4_ = 3;
          auVar170._8_4_ = 2;
          auVar170._0_8_ = 0x200000002;
          auVar170._12_4_ = 2;
          auVar170._16_4_ = 2;
          auVar170._20_4_ = 2;
          auVar170._24_4_ = 2;
          auVar170._28_4_ = 2;
          auVar121 = vblendvps_avx(auVar170,auVar149,auVar280);
          _local_780 = vpcmpgtd_avx2(auVar121,local_280);
          local_600 = vpandn_avx2(_local_780,local_760);
          auVar121 = local_760 & ~_local_780;
          if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar121 >> 0x7f,0) != '\0') ||
                (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar121 >> 0xbf,0) != '\0') ||
              (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar121[0x1f] < '\0') {
            auVar260 = vminps_avx(local_9d0,local_9f0);
            auVar106 = vmaxps_avx(local_9d0,local_9f0);
            auVar254 = vminps_avx(local_9e0,_local_a00);
            auVar7 = vminps_avx(auVar260,auVar254);
            auVar260 = vmaxps_avx(local_9e0,_local_a00);
            auVar254 = vmaxps_avx(auVar106,auVar260);
            auVar106 = vandps_avx(auVar7,local_890);
            auVar260 = vandps_avx(auVar254,local_890);
            auVar106 = vmaxps_avx(auVar106,auVar260);
            auVar260 = vmovshdup_avx(auVar106);
            auVar260 = vmaxss_avx(auVar260,auVar106);
            auVar106 = vshufpd_avx(auVar106,auVar106,1);
            auVar106 = vmaxss_avx(auVar106,auVar260);
            local_8c0._0_4_ = auVar106._0_4_ * 1.9073486e-06;
            local_820._0_16_ = vshufps_avx(auVar254,auVar254,0xff);
            local_700 = _local_4c0;
            local_720._4_4_ = (float)local_4c0._4_4_ + (float)local_740._4_4_;
            local_720._0_4_ = (float)local_4c0._0_4_ + (float)local_740._0_4_;
            fStack_718 = fStack_4b8 + fStack_738;
            fStack_714 = fStack_4b4 + fStack_734;
            fStack_710 = fStack_4b0 + fStack_730;
            fStack_70c = fStack_4ac + fStack_72c;
            fStack_708 = fStack_4a8 + fStack_728;
            fStack_704 = fStack_4a4 + fStack_724;
            do {
              auVar150._8_4_ = 0x7f800000;
              auVar150._0_8_ = 0x7f8000007f800000;
              auVar150._12_4_ = 0x7f800000;
              auVar150._16_4_ = 0x7f800000;
              auVar150._20_4_ = 0x7f800000;
              auVar150._24_4_ = 0x7f800000;
              auVar150._28_4_ = 0x7f800000;
              auVar121 = vblendvps_avx(auVar150,local_700,local_600);
              auVar280 = vshufps_avx(auVar121,auVar121,0xb1);
              auVar280 = vminps_avx(auVar121,auVar280);
              auVar111 = vshufpd_avx(auVar280,auVar280,5);
              auVar280 = vminps_avx(auVar280,auVar111);
              auVar111 = vpermpd_avx2(auVar280,0x4e);
              auVar280 = vminps_avx(auVar280,auVar111);
              auVar280 = vcmpps_avx(auVar121,auVar280,0);
              auVar111 = local_600 & auVar280;
              auVar121 = local_600;
              if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar111 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar111 >> 0x7f,0) != '\0') ||
                    (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar111 >> 0xbf,0) != '\0') ||
                  (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar111[0x1f] < '\0') {
                auVar121 = vandps_avx(auVar280,local_600);
              }
              uVar89 = vmovmskps_avx(auVar121);
              iVar11 = 0;
              for (; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x80000000) {
                iVar11 = iVar11 + 1;
              }
              uVar89 = iVar11 << 2;
              *(undefined4 *)(local_600 + uVar89) = 0;
              aVar2 = (ray->super_RayK<1>).dir.field_0;
              local_800._0_16_ = (undefined1  [16])aVar2;
              auVar106 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
              auVar194 = ZEXT464(*(uint *)(local_520 + uVar89));
              auVar262 = ZEXT464(*(uint *)(local_4a0 + uVar89));
              if (auVar106._0_4_ < 0.0) {
                local_ae0._0_16_ = ZEXT416(*(uint *)(local_520 + uVar89));
                local_b00._0_16_ = ZEXT416(*(uint *)(local_4a0 + uVar89));
                fVar223 = sqrtf(auVar106._0_4_);
                auVar262 = ZEXT1664(local_b00._0_16_);
                auVar194 = ZEXT1664(local_ae0._0_16_);
              }
              else {
                auVar106 = vsqrtss_avx(auVar106,auVar106);
                fVar223 = auVar106._0_4_;
              }
              local_8e0._0_4_ = fVar223 * 1.9073486e-06;
              lVar94 = 4;
              do {
                uVar93 = auVar262._0_4_;
                auVar105._4_4_ = uVar93;
                auVar105._0_4_ = uVar93;
                auVar105._8_4_ = uVar93;
                auVar105._12_4_ = uVar93;
                auVar260 = vfmadd213ps_fma(auVar105,local_800._0_16_,_DAT_01feba10);
                fVar234 = auVar194._0_4_;
                fVar235 = 1.0 - fVar234;
                local_9a0._0_16_ = ZEXT416((uint)fVar235);
                fVar223 = fVar234 * fVar234;
                auVar99 = SUB6416(ZEXT464(0x40400000),0);
                auVar133 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar225 = auVar194._0_16_;
                auVar254 = vfmadd213ss_fma(auVar99,auVar225,auVar133);
                auVar106 = vfmadd213ss_fma(auVar254,ZEXT416((uint)fVar223),
                                           SUB6416(ZEXT464(0x40000000),0));
                auVar7 = vfmadd213ss_fma(auVar99,ZEXT416((uint)fVar235),auVar133);
                auVar7 = vfmadd213ss_fma(auVar7,ZEXT416((uint)(fVar235 * fVar235)),
                                         SUB6416(ZEXT464(0x40000000),0));
                fVar231 = fVar235 * fVar235 * -fVar234 * 0.5;
                fVar232 = auVar106._0_4_ * 0.5;
                fVar233 = auVar7._0_4_ * 0.5;
                fVar234 = fVar234 * fVar234 * -fVar235 * 0.5;
                auVar181._0_4_ = fVar234 * (float)local_a00._0_4_;
                auVar181._4_4_ = fVar234 * (float)local_a00._4_4_;
                auVar181._8_4_ = fVar234 * fStack_9f8;
                auVar181._12_4_ = fVar234 * fStack_9f4;
                auVar200._4_4_ = fVar233;
                auVar200._0_4_ = fVar233;
                auVar200._8_4_ = fVar233;
                auVar200._12_4_ = fVar233;
                auVar106 = vfmadd132ps_fma(auVar200,auVar181,local_9e0);
                auVar161._4_4_ = fVar232;
                auVar161._0_4_ = fVar232;
                auVar161._8_4_ = fVar232;
                auVar161._12_4_ = fVar232;
                auVar106 = vfmadd132ps_fma(auVar161,auVar106,local_9f0);
                auVar182._4_4_ = fVar231;
                auVar182._0_4_ = fVar231;
                auVar182._8_4_ = fVar231;
                auVar182._12_4_ = fVar231;
                auVar106 = vfmadd132ps_fma(auVar182,auVar106,local_9d0);
                auVar133 = vfmadd231ss_fma(auVar133,auVar225,ZEXT416(0x41100000));
                auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar225,ZEXT416(0x40800000)
                                        );
                local_9c0._0_16_ = auVar7;
                local_6e0._0_16_ = auVar106;
                auVar106 = vsubps_avx(auVar260,auVar106);
                _local_980 = auVar106;
                auVar106 = vdpps_avx(auVar106,auVar106,0x7f);
                auVar260 = vfmadd213ss_fma(auVar99,auVar225,ZEXT416(0xbf800000));
                local_a20._0_16_ = auVar260;
                local_ae0._0_16_ = auVar225;
                local_b00._0_16_ = auVar262._0_16_;
                local_b20._0_16_ = auVar106;
                if (auVar106._0_4_ < 0.0) {
                  local_aa0._0_4_ = auVar254._0_4_;
                  local_a40._0_4_ = fVar223;
                  local_900._0_16_ = auVar133;
                  local_920._0_4_ = fVar235 * -2.0;
                  local_9a0._0_16_ = ZEXT416((uint)fVar235);
                  auVar216._0_4_ = sqrtf(auVar106._0_4_);
                  auVar216._4_60_ = extraout_var_00;
                  auVar254 = ZEXT416((uint)local_aa0._0_4_);
                  auVar106 = auVar216._0_16_;
                  fVar231 = (float)local_920._0_4_;
                  fVar223 = (float)local_a40._0_4_;
                  auVar133 = local_900._0_16_;
                  auVar225 = local_ae0._0_16_;
                  auVar260 = local_b00._0_16_;
                }
                else {
                  auVar106 = vsqrtss_avx(auVar106,auVar106);
                  fVar231 = fVar235 * -2.0;
                  auVar260 = auVar262._0_16_;
                }
                fVar232 = local_9a0._0_4_;
                fVar233 = auVar225._0_4_;
                auVar254 = vfmadd213ss_fma(auVar254,ZEXT416((uint)(fVar233 + fVar233)),
                                           ZEXT416((uint)(fVar233 * fVar233 * 3.0)));
                auVar156 = SUB6416(ZEXT464(0x40000000),0);
                auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar225,auVar156);
                auVar99 = vfmadd231ss_fma(ZEXT416((uint)(fVar232 * fVar232 * -3.0)),
                                          ZEXT416((uint)(fVar232 + fVar232)),auVar7);
                auVar98 = vfnmadd231ss_fma(ZEXT416((uint)(fVar233 * (fVar232 + fVar232))),
                                           local_9a0._0_16_,local_9a0._0_16_);
                auVar7 = vfmadd213ss_fma(ZEXT416((uint)fVar231),auVar225,ZEXT416((uint)fVar223));
                fVar223 = auVar98._0_4_ * 0.5;
                fVar231 = auVar254._0_4_ * 0.5;
                fVar232 = auVar99._0_4_ * 0.5;
                fVar233 = auVar7._0_4_ * 0.5;
                auVar183._0_4_ = (float)local_a00._0_4_ * fVar233;
                auVar183._4_4_ = (float)local_a00._4_4_ * fVar233;
                auVar183._8_4_ = fStack_9f8 * fVar233;
                auVar183._12_4_ = fStack_9f4 * fVar233;
                auVar162._4_4_ = fVar232;
                auVar162._0_4_ = fVar232;
                auVar162._8_4_ = fVar232;
                auVar162._12_4_ = fVar232;
                auVar254 = vfmadd213ps_fma(auVar162,local_9e0,auVar183);
                auVar136._4_4_ = fVar231;
                auVar136._0_4_ = fVar231;
                auVar136._8_4_ = fVar231;
                auVar136._12_4_ = fVar231;
                auVar254 = vfmadd213ps_fma(auVar136,local_9f0,auVar254);
                auVar270._4_4_ = fVar223;
                auVar270._0_4_ = fVar223;
                auVar270._8_4_ = fVar223;
                auVar270._12_4_ = fVar223;
                local_9a0._0_16_ = vfmadd213ps_fma(auVar270,local_9d0,auVar254);
                auVar225 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar225,auVar156);
                auVar107._0_4_ = (float)local_a00._0_4_ * (float)local_a20._0_4_;
                auVar107._4_4_ = (float)local_a00._4_4_ * (float)local_a20._0_4_;
                auVar107._8_4_ = fStack_9f8 * (float)local_a20._0_4_;
                auVar107._12_4_ = fStack_9f4 * (float)local_a20._0_4_;
                auVar163._4_4_ = local_9c0._0_4_;
                auVar163._0_4_ = local_9c0._0_4_;
                auVar163._8_4_ = local_9c0._0_4_;
                auVar163._12_4_ = local_9c0._0_4_;
                auVar254 = vfmadd213ps_fma(auVar163,local_9e0,auVar107);
                uVar93 = auVar133._0_4_;
                auVar184._4_4_ = uVar93;
                auVar184._0_4_ = uVar93;
                auVar184._8_4_ = uVar93;
                auVar184._12_4_ = uVar93;
                auVar254 = vfmadd213ps_fma(auVar184,local_9f0,auVar254);
                auVar7 = vdpps_avx(local_9a0._0_16_,local_9a0._0_16_,0x7f);
                auVar137._0_4_ = auVar225._0_4_;
                auVar137._4_4_ = auVar137._0_4_;
                auVar137._8_4_ = auVar137._0_4_;
                auVar137._12_4_ = auVar137._0_4_;
                auVar225 = vfmadd213ps_fma(auVar137,local_9d0,auVar254);
                auVar254 = vblendps_avx(auVar7,_DAT_01feba10,0xe);
                auVar133 = vrsqrtss_avx(auVar254,auVar254);
                fVar232 = auVar7._0_4_;
                fVar223 = auVar133._0_4_;
                auVar133 = vdpps_avx(local_9a0._0_16_,auVar225,0x7f);
                fVar223 = fVar223 * 1.5 + fVar232 * -0.5 * fVar223 * fVar223 * fVar223;
                auVar138._0_4_ = auVar225._0_4_ * fVar232;
                auVar138._4_4_ = auVar225._4_4_ * fVar232;
                auVar138._8_4_ = auVar225._8_4_ * fVar232;
                auVar138._12_4_ = auVar225._12_4_ * fVar232;
                fVar231 = auVar133._0_4_;
                auVar213._0_4_ = local_9a0._0_4_ * fVar231;
                auVar213._4_4_ = local_9a0._4_4_ * fVar231;
                fVar233 = local_9a0._8_4_;
                auVar213._8_4_ = fVar233 * fVar231;
                fVar234 = local_9a0._12_4_;
                auVar213._12_4_ = fVar234 * fVar231;
                auVar133 = vsubps_avx(auVar138,auVar213);
                auVar254 = vrcpss_avx(auVar254,auVar254);
                auVar225 = vfnmadd213ss_fma(auVar254,auVar7,auVar156);
                fVar231 = auVar254._0_4_ * auVar225._0_4_;
                auVar260 = vmaxss_avx(ZEXT416((uint)local_8c0._0_4_),
                                      ZEXT416((uint)(auVar260._0_4_ * (float)local_8e0._0_4_)));
                auVar245 = ZEXT1664(auVar260);
                auVar226._0_8_ = local_9a0._0_8_ ^ 0x8000000080000000;
                auVar226._8_4_ = -fVar233;
                auVar226._12_4_ = -fVar234;
                auVar185._0_4_ = fVar223 * auVar133._0_4_ * fVar231;
                auVar185._4_4_ = fVar223 * auVar133._4_4_ * fVar231;
                auVar185._8_4_ = fVar223 * auVar133._8_4_ * fVar231;
                auVar185._12_4_ = fVar223 * auVar133._12_4_ * fVar231;
                auVar256._0_4_ = local_9a0._0_4_ * fVar223;
                auVar256._4_4_ = local_9a0._4_4_ * fVar223;
                auVar256._8_4_ = fVar233 * fVar223;
                auVar256._12_4_ = fVar234 * fVar223;
                local_9c0._0_4_ = auVar260._0_4_;
                if (fVar232 < -fVar232) {
                  local_a20._0_4_ = auVar106._0_4_;
                  local_aa0._0_16_ = auVar226;
                  local_a40._0_16_ = auVar256;
                  local_900._0_16_ = auVar185;
                  fVar223 = sqrtf(fVar232);
                  auVar245 = ZEXT464((uint)local_9c0._0_4_);
                  auVar106 = ZEXT416((uint)local_a20._0_4_);
                  auVar185 = local_900._0_16_;
                  auVar226 = local_aa0._0_16_;
                  auVar256 = local_a40._0_16_;
                }
                else {
                  auVar260 = vsqrtss_avx(auVar7,auVar7);
                  fVar223 = auVar260._0_4_;
                }
                auVar260 = vdpps_avx(_local_980,auVar256,0x7f);
                auVar225 = vfmadd213ss_fma(ZEXT416((uint)local_8c0._0_4_),auVar106,auVar245._0_16_);
                auVar254 = vdpps_avx(auVar226,auVar256,0x7f);
                auVar7 = vdpps_avx(_local_980,auVar185,0x7f);
                auVar133 = vdpps_avx(local_800._0_16_,auVar256,0x7f);
                auVar225 = vfmadd213ss_fma(ZEXT416((uint)(auVar106._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_8c0._0_4_ / fVar223)),
                                           auVar225);
                auVar279 = ZEXT1664(auVar225);
                fVar223 = auVar254._0_4_ + auVar7._0_4_;
                auVar284 = ZEXT464((uint)fVar223);
                auVar108._0_4_ = auVar260._0_4_ * auVar260._0_4_;
                auVar108._4_4_ = auVar260._4_4_ * auVar260._4_4_;
                auVar108._8_4_ = auVar260._8_4_ * auVar260._8_4_;
                auVar108._12_4_ = auVar260._12_4_ * auVar260._12_4_;
                auVar106 = vdpps_avx(_local_980,auVar226,0x7f);
                auVar7 = vsubps_avx(local_b20._0_16_,auVar108);
                auVar254 = vrsqrtss_avx(auVar7,auVar7);
                fVar232 = auVar7._0_4_;
                fVar231 = auVar254._0_4_;
                fVar231 = fVar231 * 1.5 + fVar232 * -0.5 * fVar231 * fVar231 * fVar231;
                auVar254 = vdpps_avx(_local_980,local_800._0_16_,0x7f);
                auVar106 = vfnmadd231ss_fma(auVar106,auVar260,ZEXT416((uint)fVar223));
                auVar254 = vfnmadd231ss_fma(auVar254,auVar260,auVar133);
                if (fVar232 < 0.0) {
                  local_a20._0_16_ = auVar260;
                  local_aa0._0_4_ = auVar225._0_4_;
                  local_a40._0_16_ = ZEXT416((uint)fVar223);
                  local_900._0_16_ = auVar133;
                  local_920._0_16_ = auVar106;
                  local_840._0_4_ = fVar231;
                  local_860._0_16_ = auVar254;
                  fVar223 = sqrtf(fVar232);
                  auVar284 = ZEXT1664(local_a40._0_16_);
                  auVar279 = ZEXT464((uint)local_aa0._0_4_);
                  auVar245 = ZEXT464((uint)local_9c0._0_4_);
                  fVar231 = (float)local_840._0_4_;
                  auVar254 = local_860._0_16_;
                  auVar260 = local_a20._0_16_;
                  auVar133 = local_900._0_16_;
                  auVar106 = local_920._0_16_;
                }
                else {
                  auVar7 = vsqrtss_avx(auVar7,auVar7);
                  fVar223 = auVar7._0_4_;
                }
                auVar7 = vpermilps_avx(local_6e0._0_16_,0xff);
                auVar225 = vshufps_avx(local_9a0._0_16_,local_9a0._0_16_,0xff);
                auVar106 = vfmsub213ss_fma(auVar106,ZEXT416((uint)fVar231),auVar225);
                auVar186._0_8_ = auVar133._0_8_ ^ 0x8000000080000000;
                auVar186._8_4_ = auVar133._8_4_ ^ 0x80000000;
                auVar186._12_4_ = auVar133._12_4_ ^ 0x80000000;
                auVar201._0_8_ = auVar106._0_8_ ^ 0x8000000080000000;
                auVar201._8_4_ = auVar106._8_4_ ^ 0x80000000;
                auVar201._12_4_ = auVar106._12_4_ ^ 0x80000000;
                auVar99 = ZEXT416((uint)(auVar254._0_4_ * fVar231));
                auVar98 = auVar284._0_16_;
                auVar254 = vfmsub231ss_fma(ZEXT416((uint)(auVar133._0_4_ * auVar106._0_4_)),auVar98,
                                           auVar99);
                auVar106 = vinsertps_avx(auVar99,auVar186,0x10);
                uVar93 = auVar254._0_4_;
                auVar187._4_4_ = uVar93;
                auVar187._0_4_ = uVar93;
                auVar187._8_4_ = uVar93;
                auVar187._12_4_ = uVar93;
                auVar106 = vdivps_avx(auVar106,auVar187);
                auVar133 = ZEXT416((uint)(fVar223 - auVar7._0_4_));
                auVar7 = vinsertps_avx(auVar260,auVar133,0x10);
                auVar216 = ZEXT1664(auVar7);
                auVar164._0_4_ = auVar7._0_4_ * auVar106._0_4_;
                auVar164._4_4_ = auVar7._4_4_ * auVar106._4_4_;
                auVar164._8_4_ = auVar7._8_4_ * auVar106._8_4_;
                auVar164._12_4_ = auVar7._12_4_ * auVar106._12_4_;
                auVar106 = vinsertps_avx(auVar201,auVar98,0x1c);
                auVar106 = vdivps_avx(auVar106,auVar187);
                auVar188._0_4_ = auVar7._0_4_ * auVar106._0_4_;
                auVar188._4_4_ = auVar7._4_4_ * auVar106._4_4_;
                auVar188._8_4_ = auVar7._8_4_ * auVar106._8_4_;
                auVar188._12_4_ = auVar7._12_4_ * auVar106._12_4_;
                auVar106 = vhaddps_avx(auVar164,auVar164);
                auVar254 = vhaddps_avx(auVar188,auVar188);
                fVar231 = (float)local_ae0._0_4_ - auVar106._0_4_;
                auVar194 = ZEXT464((uint)fVar231);
                fVar223 = (float)local_b00._0_4_ - auVar254._0_4_;
                auVar262 = ZEXT464((uint)fVar223);
                auVar106 = vandps_avx(auVar260,local_890);
                if (auVar279._0_4_ <= auVar106._0_4_) {
LAB_016b4339:
                  bVar53 = false;
                }
                else {
                  auVar260 = vfmadd231ss_fma(ZEXT416((uint)(auVar245._0_4_ + auVar279._0_4_)),
                                             local_820._0_16_,ZEXT416(0x36000000));
                  auVar106 = vandps_avx(auVar133,local_890);
                  if (auVar260._0_4_ <= auVar106._0_4_) goto LAB_016b4339;
                  fVar223 = fVar223 + (float)local_7c0._0_4_;
                  auVar262 = ZEXT464((uint)fVar223);
                  bVar53 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar223) &&
                       (fVar232 = (ray->super_RayK<1>).tfar, fVar223 <= fVar232)) &&
                      (0.0 <= fVar231)) && (fVar231 <= 1.0)) {
                    auVar106 = vrsqrtss_avx(local_b20._0_16_,local_b20._0_16_);
                    fVar233 = auVar106._0_4_;
                    pGVar5 = (context->scene->geometries).items[local_b28].ptr;
                    if ((pGVar5->mask & (ray->super_RayK<1>).mask) != 0) {
                      fVar233 = fVar233 * 1.5 + local_b20._0_4_ * -0.5 * fVar233 * fVar233 * fVar233
                      ;
                      auVar139._0_4_ = fVar233 * (float)local_980._0_4_;
                      auVar139._4_4_ = fVar233 * (float)local_980._4_4_;
                      auVar139._8_4_ = fVar233 * fStack_978;
                      auVar139._12_4_ = fVar233 * fStack_974;
                      auVar133 = vfmadd213ps_fma(auVar225,auVar139,local_9a0._0_16_);
                      auVar106 = vshufps_avx(auVar139,auVar139,0xc9);
                      auVar260 = vshufps_avx(local_9a0._0_16_,local_9a0._0_16_,0xc9);
                      auVar140._0_4_ = auVar139._0_4_ * auVar260._0_4_;
                      auVar140._4_4_ = auVar139._4_4_ * auVar260._4_4_;
                      auVar140._8_4_ = auVar139._8_4_ * auVar260._8_4_;
                      auVar140._12_4_ = auVar139._12_4_ * auVar260._12_4_;
                      auVar254 = vfmsub231ps_fma(auVar140,local_9a0._0_16_,auVar106);
                      auVar106 = vshufps_avx(auVar254,auVar254,0xc9);
                      auVar260 = vshufps_avx(auVar133,auVar133,0xc9);
                      auVar254 = vshufps_avx(auVar254,auVar254,0xd2);
                      auVar109._0_4_ = auVar133._0_4_ * auVar254._0_4_;
                      auVar109._4_4_ = auVar133._4_4_ * auVar254._4_4_;
                      auVar109._8_4_ = auVar133._8_4_ * auVar254._8_4_;
                      auVar109._12_4_ = auVar133._12_4_ * auVar254._12_4_;
                      auVar106 = vfmsub231ps_fma(auVar109,auVar106,auVar260);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar223;
                        auVar260 = vshufps_avx(auVar106,auVar106,0xe9);
                        uVar1 = vmovlps_avx(auVar260);
                        *(undefined8 *)&(ray->Ng).field_0 = uVar1;
                        (ray->Ng).field_0.field_0.z = auVar106._0_4_;
                        ray->u = fVar231;
                        ray->v = 0.0;
                        ray->primID = (uint)local_aa8;
                        ray->geomID = (uint)local_b28;
                        ray->instID[0] = context->user->instID[0];
                        ray->instPrimID[0] = context->user->instPrimID[0];
                      }
                      else {
                        auVar260 = vshufps_avx(auVar106,auVar106,0xe9);
                        local_950 = vmovlps_avx(auVar260);
                        local_948 = auVar106._0_4_;
                        local_944 = fVar231;
                        local_940 = 0;
                        local_93c = (uint)local_aa8;
                        local_938 = (uint)local_b28;
                        local_934 = context->user->instID[0];
                        local_930 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar223;
                        local_b2c = -1;
                        local_a70.valid = &local_b2c;
                        local_a70.geometryUserPtr = pGVar5->userPtr;
                        local_a70.context = context->user;
                        local_a70.ray = (RTCRayN *)ray;
                        local_a70.hit = (RTCHitN *)&local_950;
                        local_a70.N = 1;
                        local_ae0._0_16_ = ZEXT416((uint)fVar231);
                        local_b00._0_16_ = ZEXT416((uint)fVar223);
                        local_b20._0_4_ = fVar232;
                        if (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_016b4463:
                          p_Var6 = context->args->filter;
                          if (p_Var6 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
                              auVar216 = ZEXT1664(auVar216._0_16_);
                              auVar245 = ZEXT1664(auVar245._0_16_);
                              auVar279 = ZEXT1664(auVar279._0_16_);
                              auVar284 = ZEXT1664(auVar284._0_16_);
                              (*p_Var6)(&local_a70);
                              auVar262 = ZEXT1664(local_b00._0_16_);
                              auVar194 = ZEXT1664(local_ae0._0_16_);
                              fVar232 = (float)local_b20._0_4_;
                            }
                            if (*local_a70.valid == 0) goto LAB_016b4509;
                          }
                          (((Vec3f *)((long)local_a70.ray + 0x30))->field_0).components[0] =
                               *(float *)local_a70.hit;
                          (((Vec3f *)((long)local_a70.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_a70.hit + 4);
                          (((Vec3f *)((long)local_a70.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_a70.hit + 8);
                          *(float *)((long)local_a70.ray + 0x3c) = *(float *)(local_a70.hit + 0xc);
                          *(float *)((long)local_a70.ray + 0x40) = *(float *)(local_a70.hit + 0x10);
                          *(float *)((long)local_a70.ray + 0x44) = *(float *)(local_a70.hit + 0x14);
                          *(float *)((long)local_a70.ray + 0x48) = *(float *)(local_a70.hit + 0x18);
                          *(float *)((long)local_a70.ray + 0x4c) = *(float *)(local_a70.hit + 0x1c);
                          *(float *)((long)local_a70.ray + 0x50) = *(float *)(local_a70.hit + 0x20);
                        }
                        else {
                          auVar216 = ZEXT1664(auVar7);
                          auVar245 = ZEXT1664(auVar245._0_16_);
                          auVar279 = ZEXT1664(auVar279._0_16_);
                          auVar284 = ZEXT1664(auVar98);
                          (*pGVar5->intersectionFilterN)(&local_a70);
                          auVar262 = ZEXT1664(local_b00._0_16_);
                          auVar194 = ZEXT1664(local_ae0._0_16_);
                          fVar232 = (float)local_b20._0_4_;
                          if (*local_a70.valid != 0) goto LAB_016b4463;
LAB_016b4509:
                          (ray->super_RayK<1>).tfar = fVar232;
                        }
                      }
                    }
                  }
                }
                auVar121 = local_600;
                bVar95 = lVar94 != 0;
                lVar94 = lVar94 + -1;
              } while ((!bVar53) && (bVar95));
              fVar223 = (ray->super_RayK<1>).tfar;
              auVar123._4_4_ = fVar223;
              auVar123._0_4_ = fVar223;
              auVar123._8_4_ = fVar223;
              auVar123._12_4_ = fVar223;
              auVar123._16_4_ = fVar223;
              auVar123._20_4_ = fVar223;
              auVar123._24_4_ = fVar223;
              auVar123._28_4_ = fVar223;
              auVar280 = vcmpps_avx(_local_720,auVar123,2);
              local_600 = vandps_avx(auVar280,local_600);
              auVar121 = auVar121 & auVar280;
            } while ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar121 >> 0x7f,0) != '\0') ||
                       (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar121 >> 0xbf,0) != '\0') ||
                     (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar121[0x1f] < '\0');
          }
          auVar151._0_4_ = (float)local_740._0_4_ + local_480._0_4_;
          auVar151._4_4_ = (float)local_740._4_4_ + local_480._4_4_;
          auVar151._8_4_ = fStack_738 + local_480._8_4_;
          auVar151._12_4_ = fStack_734 + local_480._12_4_;
          auVar151._16_4_ = fStack_730 + local_480._16_4_;
          auVar151._20_4_ = fStack_72c + local_480._20_4_;
          auVar151._24_4_ = fStack_728 + local_480._24_4_;
          auVar151._28_4_ = fStack_724 + local_480._28_4_;
          fVar223 = (ray->super_RayK<1>).tfar;
          auVar192._4_4_ = fVar223;
          auVar192._0_4_ = fVar223;
          auVar192._8_4_ = fVar223;
          auVar192._12_4_ = fVar223;
          auVar192._16_4_ = fVar223;
          auVar192._20_4_ = fVar223;
          auVar192._24_4_ = fVar223;
          auVar192._28_4_ = fVar223;
          auVar280 = vcmpps_avx(auVar151,auVar192,2);
          auVar121 = vandps_avx(local_6c0,local_5a0);
          auVar121 = vandps_avx(auVar280,auVar121);
          auVar202._0_4_ = (float)local_740._0_4_ + local_4c0._0_4_;
          auVar202._4_4_ = (float)local_740._4_4_ + local_4c0._4_4_;
          auVar202._8_4_ = fStack_738 + local_4c0._8_4_;
          auVar202._12_4_ = fStack_734 + local_4c0._12_4_;
          auVar202._16_4_ = fStack_730 + local_4c0._16_4_;
          auVar202._20_4_ = fStack_72c + local_4c0._20_4_;
          auVar202._24_4_ = fStack_728 + local_4c0._24_4_;
          auVar202._28_4_ = fStack_724 + local_4c0._28_4_;
          auVar111 = vcmpps_avx(auVar202,auVar192,2);
          auVar280 = vandps_avx(_local_780,local_760);
          auVar280 = vandps_avx(auVar111,auVar280);
          auVar280 = vorps_avx(auVar121,auVar280);
          if ((((((((auVar280 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar280 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar280 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar280 >> 0x7f,0) != '\0') ||
                (auVar280 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar280 >> 0xbf,0) != '\0') ||
              (auVar280 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar280[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar91 * 0x60) = auVar280;
            auVar121 = vblendvps_avx(_local_4c0,local_480,auVar121);
            *(undefined1 (*) [32])(auStack_160 + uVar91 * 0x60) = auVar121;
            auVar62._8_8_ = uStack_7c8;
            auVar62._0_8_ = local_7d0;
            uVar1 = vmovlps_avx(auVar62);
            *(undefined8 *)(afStack_140 + uVar91 * 0x18) = uVar1;
            auStack_138[uVar91 * 0x18] = (int)local_640 + 1;
            uVar91 = (ulong)((int)uVar91 + 1);
          }
        }
      }
    }
    fVar223 = (ray->super_RayK<1>).tfar;
    auVar124._4_4_ = fVar223;
    auVar124._0_4_ = fVar223;
    auVar124._8_4_ = fVar223;
    auVar124._12_4_ = fVar223;
    auVar124._16_4_ = fVar223;
    auVar124._20_4_ = fVar223;
    auVar124._24_4_ = fVar223;
    auVar124._28_4_ = fVar223;
    do {
      if ((int)uVar91 == 0) {
        fVar223 = (ray->super_RayK<1>).tfar;
        auVar110._4_4_ = fVar223;
        auVar110._0_4_ = fVar223;
        auVar110._8_4_ = fVar223;
        auVar110._12_4_ = fVar223;
        auVar106 = vcmpps_avx(local_4d0,auVar110,2);
        uVar89 = vmovmskps_avx(auVar106);
        uVar89 = (uint)local_7a8 & uVar89;
        if (uVar89 == 0) {
          return;
        }
        goto LAB_016b1f54;
      }
      uVar90 = (ulong)((int)uVar91 - 1);
      lVar94 = uVar90 * 0x60;
      auVar280 = *(undefined1 (*) [32])(auStack_180 + lVar94);
      auVar121 = *(undefined1 (*) [32])(auStack_160 + lVar94);
      auVar152._0_4_ = auVar121._0_4_ + (float)local_740._0_4_;
      auVar152._4_4_ = auVar121._4_4_ + (float)local_740._4_4_;
      auVar152._8_4_ = auVar121._8_4_ + fStack_738;
      auVar152._12_4_ = auVar121._12_4_ + fStack_734;
      auVar152._16_4_ = auVar121._16_4_ + fStack_730;
      auVar152._20_4_ = auVar121._20_4_ + fStack_72c;
      auVar152._24_4_ = auVar121._24_4_ + fStack_728;
      auVar152._28_4_ = auVar121._28_4_ + fStack_724;
      auVar8 = vcmpps_avx(auVar152,auVar124,2);
      auVar111 = vandps_avx(auVar8,auVar280);
      local_480 = auVar111;
      auVar8 = auVar280 & auVar8;
      bVar59 = (auVar8 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar60 = (auVar8 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar58 = (auVar8 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar57 = SUB321(auVar8 >> 0x7f,0) == '\0';
      bVar56 = (auVar8 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar55 = SUB321(auVar8 >> 0xbf,0) == '\0';
      bVar95 = (auVar8 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar53 = -1 < auVar8[0x1f];
      if (((((((!bVar59 || !bVar60) || !bVar58) || !bVar57) || !bVar56) || !bVar55) || !bVar95) ||
          !bVar53) {
        auVar193._8_4_ = 0x7f800000;
        auVar193._0_8_ = 0x7f8000007f800000;
        auVar193._12_4_ = 0x7f800000;
        auVar193._16_4_ = 0x7f800000;
        auVar193._20_4_ = 0x7f800000;
        auVar193._24_4_ = 0x7f800000;
        auVar193._28_4_ = 0x7f800000;
        auVar121 = vblendvps_avx(auVar193,auVar121,auVar111);
        auVar280 = vshufps_avx(auVar121,auVar121,0xb1);
        auVar280 = vminps_avx(auVar121,auVar280);
        auVar8 = vshufpd_avx(auVar280,auVar280,5);
        auVar280 = vminps_avx(auVar280,auVar8);
        auVar8 = vpermpd_avx2(auVar280,0x4e);
        auVar280 = vminps_avx(auVar280,auVar8);
        auVar121 = vcmpps_avx(auVar121,auVar280,0);
        auVar280 = auVar111 & auVar121;
        if ((((((((auVar280 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar280 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar280 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar280 >> 0x7f,0) != '\0') ||
              (auVar280 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar280 >> 0xbf,0) != '\0') ||
            (auVar280 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar280[0x1f] < '\0') {
          auVar111 = vandps_avx(auVar121,auVar111);
        }
        fVar223 = afStack_140[uVar90 * 0x18 + 1];
        local_640 = (ulong)auStack_138[uVar90 * 0x18];
        uVar89 = vmovmskps_avx(auVar111);
        iVar11 = 0;
        for (; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x80000000) {
          iVar11 = iVar11 + 1;
        }
        fVar231 = afStack_140[uVar90 * 0x18];
        auVar153._4_4_ = fVar231;
        auVar153._0_4_ = fVar231;
        auVar153._8_4_ = fVar231;
        auVar153._12_4_ = fVar231;
        auVar153._16_4_ = fVar231;
        auVar153._20_4_ = fVar231;
        auVar153._24_4_ = fVar231;
        auVar153._28_4_ = fVar231;
        *(undefined4 *)(local_480 + (uint)(iVar11 << 2)) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar94) = local_480;
        if ((((((((local_480 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (local_480 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_480 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(local_480 >> 0x7f,0) != '\0') ||
              (local_480 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(local_480 >> 0xbf,0) != '\0') ||
            (local_480 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_480[0x1f] < '\0') {
          uVar90 = uVar91;
        }
        fVar223 = fVar223 - fVar231;
        auVar171._4_4_ = fVar223;
        auVar171._0_4_ = fVar223;
        auVar171._8_4_ = fVar223;
        auVar171._12_4_ = fVar223;
        auVar171._16_4_ = fVar223;
        auVar171._20_4_ = fVar223;
        auVar171._24_4_ = fVar223;
        auVar171._28_4_ = fVar223;
        auVar106 = vfmadd132ps_fma(auVar171,auVar153,_DAT_02020f20);
        _local_4c0 = ZEXT1632(auVar106);
        local_7d0 = *(undefined8 *)(local_4c0 + (uint)(iVar11 << 2));
        uStack_7c8 = 0;
        auVar280 = local_480;
      }
      uVar91 = uVar90;
      auVar194 = ZEXT3264(auVar280);
      uVar90 = local_640;
    } while (((((((bVar59 && bVar60) && bVar58) && bVar57) && bVar56) && bVar55) && bVar95) &&
             bVar53);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }